

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# curveNi_mb_intersector.h
# Opt level: O1

bool embree::sse2::CurveNiMBIntersector1<4>::
     occluded_n<embree::sse2::OrientedCurve1Intersector1<embree::BezierCurveT,3,4>,embree::sse2::Occluded1Epilog1<true>>
               (Precalculations *pre,Ray *ray,RayQueryContext *context,Primitive *prim)

{
  long lVar1;
  long lVar2;
  float *pfVar3;
  float *pfVar4;
  float *pfVar5;
  float *pfVar6;
  float *pfVar7;
  Primitive *pPVar8;
  ulong uVar9;
  ulong uVar10;
  ulong uVar11;
  ulong uVar12;
  ulong uVar13;
  Primitive PVar14;
  undefined4 uVar15;
  Geometry *pGVar16;
  __int_type_conflict _Var17;
  long lVar18;
  long lVar19;
  long lVar20;
  long lVar21;
  bool bVar22;
  bool bVar23;
  undefined1 auVar24 [12];
  undefined1 auVar25 [12];
  undefined1 auVar26 [12];
  undefined1 auVar27 [12];
  undefined1 auVar28 [12];
  undefined3 uVar29;
  undefined1 auVar30 [12];
  undefined1 auVar31 [12];
  undefined8 uVar32;
  undefined1 auVar33 [16];
  undefined6 uVar34;
  undefined1 auVar35 [12];
  undefined1 auVar36 [12];
  undefined1 auVar37 [12];
  undefined1 auVar38 [12];
  undefined1 auVar39 [12];
  undefined1 auVar40 [12];
  undefined1 auVar41 [12];
  undefined1 auVar42 [12];
  undefined1 auVar43 [12];
  undefined1 auVar44 [12];
  undefined1 auVar45 [12];
  undefined1 auVar46 [12];
  undefined1 auVar47 [12];
  undefined1 auVar48 [12];
  undefined1 auVar49 [12];
  undefined1 auVar50 [12];
  undefined1 auVar51 [12];
  undefined1 auVar52 [12];
  undefined1 auVar53 [12];
  undefined1 auVar54 [12];
  undefined1 auVar55 [12];
  undefined1 auVar56 [16];
  byte bVar57;
  ulong uVar58;
  ulong uVar59;
  ulong uVar60;
  ulong uVar61;
  RTCFilterFunctionN p_Var62;
  int iVar63;
  ulong uVar64;
  ulong uVar65;
  ulong uVar66;
  long lVar67;
  bool bVar68;
  uint uVar69;
  uint uVar70;
  int iVar71;
  uint uVar72;
  uint uVar73;
  short sVar74;
  float t1;
  undefined2 uVar103;
  float fVar75;
  float fVar104;
  float fVar105;
  undefined1 auVar76 [16];
  undefined1 auVar77 [16];
  undefined1 auVar78 [16];
  undefined1 auVar81 [16];
  undefined1 auVar84 [16];
  undefined1 auVar87 [16];
  undefined1 auVar90 [16];
  undefined1 auVar93 [16];
  undefined1 auVar94 [16];
  undefined1 auVar95 [16];
  undefined1 auVar96 [16];
  undefined1 auVar97 [16];
  undefined1 auVar98 [16];
  undefined1 auVar99 [16];
  undefined1 auVar100 [16];
  undefined1 auVar101 [16];
  float fVar106;
  float fVar125;
  float fVar126;
  undefined1 auVar107 [16];
  undefined1 auVar110 [16];
  undefined1 auVar113 [16];
  undefined1 auVar116 [16];
  undefined1 auVar117 [16];
  undefined1 auVar118 [16];
  undefined1 auVar119 [16];
  undefined1 auVar120 [16];
  undefined1 auVar121 [16];
  undefined1 auVar122 [16];
  undefined1 auVar123 [16];
  undefined1 auVar124 [16];
  float fVar127;
  float fVar144;
  float fVar145;
  vfloat4 v;
  undefined1 auVar128 [16];
  undefined1 auVar129 [16];
  undefined1 auVar130 [16];
  undefined1 auVar131 [16];
  undefined1 auVar132 [16];
  undefined1 auVar133 [16];
  undefined1 auVar134 [16];
  undefined1 auVar135 [16];
  undefined1 auVar136 [16];
  undefined1 auVar137 [16];
  undefined1 auVar138 [16];
  undefined1 auVar139 [16];
  undefined1 auVar140 [16];
  undefined1 auVar141 [16];
  undefined1 auVar142 [16];
  undefined1 auVar143 [16];
  float fVar146;
  float fVar162;
  float fVar163;
  vfloat4 v_1;
  undefined1 auVar147 [16];
  undefined1 auVar148 [16];
  undefined1 auVar151 [16];
  undefined1 auVar152 [16];
  undefined1 auVar153 [16];
  undefined1 auVar154 [16];
  undefined1 auVar155 [16];
  undefined1 auVar156 [16];
  undefined1 auVar157 [16];
  undefined1 auVar158 [16];
  undefined1 auVar159 [16];
  undefined1 auVar161 [16];
  float fVar164;
  float fVar167;
  float fVar168;
  vfloat4 a;
  undefined1 auVar165 [16];
  undefined1 auVar166 [16];
  float fVar169;
  float fVar192;
  float fVar193;
  vfloat_impl<4> p00;
  undefined1 auVar170 [16];
  undefined1 auVar173 [16];
  undefined1 auVar176 [16];
  undefined1 auVar179 [16];
  undefined1 auVar182 [16];
  undefined1 auVar185 [16];
  undefined1 auVar186 [16];
  undefined1 auVar187 [16];
  undefined1 auVar188 [16];
  undefined1 auVar189 [16];
  undefined1 auVar190 [16];
  undefined1 auVar191 [16];
  float fVar194;
  float fVar204;
  float fVar205;
  undefined1 auVar195 [16];
  undefined1 auVar196 [16];
  undefined1 auVar197 [16];
  undefined1 auVar198 [16];
  undefined1 auVar199 [16];
  undefined1 auVar200 [16];
  undefined1 auVar201 [16];
  undefined1 auVar202 [16];
  undefined1 auVar203 [16];
  float fVar206;
  float fVar215;
  float fVar216;
  undefined1 auVar207 [16];
  undefined1 auVar208 [16];
  undefined1 auVar211 [16];
  float fVar217;
  float fVar218;
  float fVar219;
  float fVar220;
  undefined1 auVar212 [16];
  undefined1 auVar213 [16];
  undefined1 auVar214 [16];
  float fVar221;
  float fVar222;
  float fVar232;
  float fVar233;
  float fVar234;
  float fVar235;
  float fVar236;
  undefined1 auVar223 [16];
  undefined1 auVar224 [16];
  undefined1 auVar225 [16];
  undefined1 auVar226 [16];
  undefined1 auVar227 [16];
  undefined1 auVar228 [16];
  undefined1 auVar229 [16];
  undefined1 auVar230 [16];
  undefined1 auVar231 [16];
  float fVar237;
  float fVar238;
  float fVar239;
  float fVar250;
  float fVar253;
  undefined1 auVar240 [16];
  undefined1 auVar243 [16];
  float fVar251;
  float fVar252;
  float fVar254;
  float fVar255;
  float fVar256;
  float fVar257;
  undefined1 auVar244 [16];
  undefined1 auVar245 [16];
  undefined1 auVar246 [16];
  undefined1 auVar247 [16];
  undefined1 auVar248 [16];
  undefined1 auVar249 [16];
  float fVar258;
  float fVar259;
  float fVar260;
  float fVar269;
  float fVar272;
  vfloat4 a_1;
  undefined1 auVar261 [16];
  undefined1 auVar264 [16];
  float fVar270;
  float fVar271;
  float fVar273;
  float fVar274;
  float fVar275;
  float fVar276;
  float fVar277;
  float fVar278;
  float fVar279;
  undefined1 auVar265 [16];
  undefined1 auVar266 [16];
  undefined1 auVar267 [16];
  undefined1 auVar268 [16];
  float fVar280;
  float fVar281;
  float fVar290;
  float fVar292;
  vfloat4 a_2;
  float fVar294;
  undefined1 auVar282 [16];
  undefined1 auVar283 [16];
  undefined1 auVar286 [16];
  float fVar291;
  float fVar293;
  float fVar295;
  undefined1 auVar287 [16];
  undefined1 auVar288 [16];
  undefined1 auVar289 [16];
  float fVar296;
  float fVar297;
  float fVar306;
  float fVar308;
  float fVar310;
  undefined1 auVar298 [16];
  undefined1 auVar299 [16];
  undefined1 auVar302 [16];
  float fVar307;
  float fVar309;
  float fVar311;
  undefined1 auVar303 [16];
  undefined1 auVar304 [16];
  undefined1 auVar305 [16];
  float fVar312;
  float fVar313;
  float fVar317;
  float fVar318;
  float fVar319;
  undefined1 auVar314 [16];
  undefined1 auVar315 [16];
  undefined1 auVar316 [16];
  undefined1 auVar320 [16];
  undefined1 auVar321 [16];
  undefined1 auVar322 [16];
  undefined1 auVar323 [16];
  undefined1 auVar324 [16];
  undefined1 auVar325 [16];
  undefined1 auVar326 [16];
  undefined1 auVar327 [16];
  undefined1 auVar328 [16];
  undefined1 auVar329 [16];
  undefined1 auVar330 [16];
  undefined1 auVar331 [16];
  undefined1 auVar332 [16];
  undefined1 auVar333 [16];
  vfloat_impl<4> p02;
  vfloat_impl<4> p01;
  vfloat_impl<4> p00_1;
  RTCFilterFunctionNArguments args;
  uint mask_stack [4];
  vfloat_impl<4> p03;
  BBox1f cu_stack [4];
  BBox1f cv_stack [4];
  bool local_43d;
  uint local_43c;
  float fStack_430;
  float fStack_42c;
  undefined8 local_428;
  undefined4 local_3ec;
  float local_3e8;
  float fStack_3e4;
  float fStack_3e0;
  float fStack_3dc;
  float local_3d8;
  float fStack_3d4;
  float fStack_3d0;
  float fStack_3cc;
  float local_3c8;
  float fStack_3c4;
  float fStack_3c0;
  float fStack_3bc;
  float local_3b8;
  float fStack_3b4;
  float fStack_3b0;
  float fStack_3ac;
  float local_3a8;
  float fStack_3a4;
  float fStack_3a0;
  float fStack_39c;
  float local_398;
  float fStack_394;
  float fStack_390;
  float fStack_38c;
  float local_388;
  float fStack_384;
  float fStack_380;
  float fStack_37c;
  undefined8 local_378;
  undefined8 uStack_370;
  ulong local_360;
  float local_358;
  float fStack_354;
  float fStack_350;
  float fStack_34c;
  undefined1 local_348 [8];
  float fStack_340;
  float fStack_33c;
  undefined8 local_338;
  undefined8 uStack_330;
  undefined1 local_328 [8];
  float fStack_320;
  float fStack_31c;
  float local_318;
  float fStack_314;
  float fStack_310;
  float fStack_30c;
  ulong local_300;
  Primitive *local_2f8;
  long local_2f0;
  RTCFilterFunctionNArguments local_2e8;
  float local_2b8;
  float fStack_2b4;
  float fStack_2b0;
  float fStack_2ac;
  float local_2a8;
  float fStack_2a4;
  float fStack_2a0;
  float fStack_29c;
  float local_298;
  float fStack_294;
  float fStack_290;
  float fStack_28c;
  undefined1 local_288 [16];
  undefined8 local_278;
  undefined8 uStack_270;
  undefined8 local_268;
  undefined8 uStack_260;
  undefined8 local_258;
  undefined8 uStack_250;
  undefined8 local_248;
  undefined8 uStack_240;
  undefined8 local_238;
  undefined8 uStack_230;
  undefined8 local_228;
  undefined8 uStack_220;
  undefined8 local_218;
  undefined8 uStack_210;
  undefined8 local_208;
  undefined8 uStack_200;
  uint auStack_1f8 [4];
  undefined8 local_1e8;
  float local_1e0;
  float local_1dc;
  float fStack_1d8;
  undefined4 local_1d4;
  undefined4 local_1d0;
  uint local_1cc;
  uint local_1c8;
  float local_1b8;
  float fStack_1b4;
  float fStack_1b0;
  float fStack_1ac;
  float local_1a8;
  float fStack_1a4;
  float fStack_1a0;
  float fStack_19c;
  float local_198;
  float fStack_194;
  float fStack_190;
  float fStack_18c;
  float local_188;
  float fStack_184;
  float fStack_180;
  float fStack_17c;
  float local_178;
  float fStack_174;
  float fStack_170;
  float fStack_16c;
  undefined1 local_168 [16];
  float local_158;
  float fStack_154;
  float fStack_150;
  float fStack_14c;
  float local_148;
  float fStack_144;
  float fStack_140;
  float fStack_13c;
  undefined1 local_138 [16];
  undefined1 local_128 [16];
  undefined1 local_118 [16];
  float local_108;
  float fStack_104;
  float fStack_100;
  float fStack_fc;
  undefined1 local_f8 [16];
  undefined1 local_e8 [16];
  undefined1 local_d8 [16];
  undefined1 local_c8 [16];
  undefined1 local_b8 [8];
  float fStack_b0;
  float fStack_ac;
  float local_a8;
  float fStack_a4;
  float fStack_a0;
  float fStack_9c;
  float local_98;
  float fStack_94;
  float fStack_90;
  float fStack_8c;
  float local_88;
  float fStack_84;
  float fStack_80;
  float fStack_7c;
  float afStack_78 [8];
  undefined8 auStack_58 [5];
  undefined1 auVar79 [16];
  undefined1 auVar80 [16];
  undefined1 auVar82 [16];
  undefined1 auVar83 [16];
  undefined1 auVar85 [16];
  undefined1 auVar86 [16];
  undefined1 auVar88 [16];
  undefined1 auVar89 [16];
  undefined1 auVar91 [16];
  undefined1 auVar92 [16];
  undefined1 uVar102;
  undefined1 auVar108 [16];
  undefined1 auVar109 [16];
  undefined1 auVar111 [16];
  undefined1 auVar112 [16];
  undefined1 auVar114 [16];
  undefined1 auVar115 [16];
  undefined1 auVar160 [16];
  undefined1 auVar149 [16];
  undefined1 auVar150 [16];
  undefined1 auVar171 [16];
  undefined1 auVar172 [16];
  undefined1 auVar174 [16];
  undefined1 auVar175 [16];
  undefined1 auVar177 [16];
  undefined1 auVar178 [16];
  undefined1 auVar180 [16];
  undefined1 auVar181 [16];
  undefined1 auVar183 [16];
  undefined1 auVar184 [16];
  undefined1 auVar209 [16];
  undefined1 auVar210 [16];
  undefined1 auVar241 [16];
  undefined1 auVar242 [16];
  undefined1 auVar262 [16];
  undefined1 auVar263 [16];
  undefined1 auVar284 [16];
  undefined1 auVar285 [16];
  undefined1 auVar300 [16];
  undefined1 auVar301 [16];
  
  PVar14 = prim[1];
  uVar58 = (ulong)(byte)PVar14;
  lVar21 = uVar58 * 0x25;
  pPVar8 = prim + lVar21 + 6;
  fVar145 = *(float *)(pPVar8 + 0xc);
  fVar146 = ((ray->org).field_0.m128[0] - *(float *)pPVar8) * fVar145;
  fVar162 = ((ray->org).field_0.m128[1] - *(float *)(pPVar8 + 4)) * fVar145;
  fVar163 = ((ray->org).field_0.m128[2] - *(float *)(pPVar8 + 8)) * fVar145;
  fVar127 = fVar145 * (ray->dir).field_0.m128[0];
  fVar144 = fVar145 * (ray->dir).field_0.m128[1];
  fVar145 = fVar145 * (ray->dir).field_0.m128[2];
  uVar15 = *(undefined4 *)(prim + uVar58 * 4 + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar120._8_4_ = 0;
  auVar120._0_8_ = uVar64;
  auVar120._12_2_ = uVar103;
  auVar120._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar129._12_4_ = auVar120._12_4_;
  auVar129._8_2_ = 0;
  auVar129._0_8_ = uVar64;
  auVar129._10_2_ = uVar103;
  auVar76._10_6_ = auVar129._10_6_;
  auVar76._8_2_ = uVar103;
  auVar76._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar35._4_8_ = auVar76._8_8_;
  auVar35._2_2_ = uVar103;
  auVar35._0_2_ = uVar103;
  fVar312 = (float)((int)sVar74 >> 8);
  fVar317 = (float)(auVar35._0_4_ >> 0x18);
  fVar318 = (float)(auVar76._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar58 * 5 + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar109._8_4_ = 0;
  auVar109._0_8_ = uVar64;
  auVar109._12_2_ = uVar103;
  auVar109._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar108._12_4_ = auVar109._12_4_;
  auVar108._8_2_ = 0;
  auVar108._0_8_ = uVar64;
  auVar108._10_2_ = uVar103;
  auVar107._10_6_ = auVar108._10_6_;
  auVar107._8_2_ = uVar103;
  auVar107._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar36._4_8_ = auVar107._8_8_;
  auVar36._2_2_ = uVar103;
  auVar36._0_2_ = uVar103;
  fVar164 = (float)((int)sVar74 >> 8);
  fVar167 = (float)(auVar36._0_4_ >> 0x18);
  fVar168 = (float)(auVar107._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar58 * 6 + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar112._8_4_ = 0;
  auVar112._0_8_ = uVar64;
  auVar112._12_2_ = uVar103;
  auVar112._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar111._12_4_ = auVar112._12_4_;
  auVar111._8_2_ = 0;
  auVar111._0_8_ = uVar64;
  auVar111._10_2_ = uVar103;
  auVar110._10_6_ = auVar111._10_6_;
  auVar110._8_2_ = uVar103;
  auVar110._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar37._4_8_ = auVar110._8_8_;
  auVar37._2_2_ = uVar103;
  auVar37._0_2_ = uVar103;
  fVar194 = (float)((int)sVar74 >> 8);
  fVar204 = (float)(auVar37._0_4_ >> 0x18);
  fVar205 = (float)(auVar110._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar58 * 0xf + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar115._8_4_ = 0;
  auVar115._0_8_ = uVar64;
  auVar115._12_2_ = uVar103;
  auVar115._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar114._12_4_ = auVar115._12_4_;
  auVar114._8_2_ = 0;
  auVar114._0_8_ = uVar64;
  auVar114._10_2_ = uVar103;
  auVar113._10_6_ = auVar114._10_6_;
  auVar113._8_2_ = uVar103;
  auVar113._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar38._4_8_ = auVar113._8_8_;
  auVar38._2_2_ = uVar103;
  auVar38._0_2_ = uVar103;
  fVar75 = (float)((int)sVar74 >> 8);
  fVar104 = (float)(auVar38._0_4_ >> 0x18);
  fVar105 = (float)(auVar113._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar172._8_4_ = 0;
  auVar172._0_8_ = uVar64;
  auVar172._12_2_ = uVar103;
  auVar172._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar171._12_4_ = auVar172._12_4_;
  auVar171._8_2_ = 0;
  auVar171._0_8_ = uVar64;
  auVar171._10_2_ = uVar103;
  auVar170._10_6_ = auVar171._10_6_;
  auVar170._8_2_ = uVar103;
  auVar170._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar39._4_8_ = auVar170._8_8_;
  auVar39._2_2_ = uVar103;
  auVar39._0_2_ = uVar103;
  fVar206 = (float)((int)sVar74 >> 8);
  fVar215 = (float)(auVar39._0_4_ >> 0x18);
  fVar216 = (float)(auVar170._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + (ulong)(byte)PVar14 * 0x10 + uVar58 + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar175._8_4_ = 0;
  auVar175._0_8_ = uVar64;
  auVar175._12_2_ = uVar103;
  auVar175._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar174._12_4_ = auVar175._12_4_;
  auVar174._8_2_ = 0;
  auVar174._0_8_ = uVar64;
  auVar174._10_2_ = uVar103;
  auVar173._10_6_ = auVar174._10_6_;
  auVar173._8_2_ = uVar103;
  auVar173._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar40._4_8_ = auVar173._8_8_;
  auVar40._2_2_ = uVar103;
  auVar40._0_2_ = uVar103;
  fVar237 = (float)((int)sVar74 >> 8);
  fVar250 = (float)(auVar40._0_4_ >> 0x18);
  fVar253 = (float)(auVar173._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar58 * 0x1a + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar178._8_4_ = 0;
  auVar178._0_8_ = uVar64;
  auVar178._12_2_ = uVar103;
  auVar178._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar177._12_4_ = auVar178._12_4_;
  auVar177._8_2_ = 0;
  auVar177._0_8_ = uVar64;
  auVar177._10_2_ = uVar103;
  auVar176._10_6_ = auVar177._10_6_;
  auVar176._8_2_ = uVar103;
  auVar176._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar41._4_8_ = auVar176._8_8_;
  auVar41._2_2_ = uVar103;
  auVar41._0_2_ = uVar103;
  fVar221 = (float)((int)sVar74 >> 8);
  fVar232 = (float)(auVar41._0_4_ >> 0x18);
  fVar234 = (float)(auVar176._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar58 * 0x1b + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar181._8_4_ = 0;
  auVar181._0_8_ = uVar64;
  auVar181._12_2_ = uVar103;
  auVar181._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar180._12_4_ = auVar181._12_4_;
  auVar180._8_2_ = 0;
  auVar180._0_8_ = uVar64;
  auVar180._10_2_ = uVar103;
  auVar179._10_6_ = auVar180._10_6_;
  auVar179._8_2_ = uVar103;
  auVar179._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar42._4_8_ = auVar179._8_8_;
  auVar42._2_2_ = uVar103;
  auVar42._0_2_ = uVar103;
  fVar258 = (float)((int)sVar74 >> 8);
  fVar269 = (float)(auVar42._0_4_ >> 0x18);
  fVar272 = (float)(auVar179._8_4_ >> 0x18);
  uVar15 = *(undefined4 *)(prim + uVar58 * 0x1c + 6);
  uVar102 = (undefined1)((uint)uVar15 >> 0x18);
  uVar103 = CONCAT11(uVar102,uVar102);
  uVar102 = (undefined1)((uint)uVar15 >> 0x10);
  uVar32 = CONCAT35(CONCAT21(uVar103,uVar102),CONCAT14(uVar102,uVar15));
  uVar102 = (undefined1)((uint)uVar15 >> 8);
  uVar34 = CONCAT51(CONCAT41((int)((ulong)uVar32 >> 0x20),uVar102),uVar102);
  sVar74 = CONCAT11((char)uVar15,(char)uVar15);
  uVar64 = CONCAT62(uVar34,sVar74);
  auVar184._8_4_ = 0;
  auVar184._0_8_ = uVar64;
  auVar184._12_2_ = uVar103;
  auVar184._14_2_ = uVar103;
  uVar103 = (undefined2)((ulong)uVar32 >> 0x20);
  auVar183._12_4_ = auVar184._12_4_;
  auVar183._8_2_ = 0;
  auVar183._0_8_ = uVar64;
  auVar183._10_2_ = uVar103;
  auVar182._10_6_ = auVar183._10_6_;
  auVar182._8_2_ = uVar103;
  auVar182._0_8_ = uVar64;
  uVar103 = (undefined2)uVar34;
  auVar43._4_8_ = auVar182._8_8_;
  auVar43._2_2_ = uVar103;
  auVar43._0_2_ = uVar103;
  fVar106 = (float)((int)sVar74 >> 8);
  fVar125 = (float)(auVar43._0_4_ >> 0x18);
  fVar126 = (float)(auVar182._8_4_ >> 0x18);
  fVar296 = fVar127 * fVar312 + fVar144 * fVar164 + fVar145 * fVar194;
  fVar306 = fVar127 * fVar317 + fVar144 * fVar167 + fVar145 * fVar204;
  fVar308 = fVar127 * fVar318 + fVar144 * fVar168 + fVar145 * fVar205;
  fVar310 = fVar127 * (float)(auVar129._12_4_ >> 0x18) +
            fVar144 * (float)(auVar108._12_4_ >> 0x18) + fVar145 * (float)(auVar111._12_4_ >> 0x18);
  fVar280 = fVar127 * fVar75 + fVar144 * fVar206 + fVar145 * fVar237;
  fVar290 = fVar127 * fVar104 + fVar144 * fVar215 + fVar145 * fVar250;
  fVar292 = fVar127 * fVar105 + fVar144 * fVar216 + fVar145 * fVar253;
  fVar294 = fVar127 * (float)(auVar114._12_4_ >> 0x18) +
            fVar144 * (float)(auVar171._12_4_ >> 0x18) + fVar145 * (float)(auVar174._12_4_ >> 0x18);
  fVar169 = fVar127 * fVar221 + fVar144 * fVar258 + fVar145 * fVar106;
  fVar192 = fVar127 * fVar232 + fVar144 * fVar269 + fVar145 * fVar125;
  fVar193 = fVar127 * fVar234 + fVar144 * fVar272 + fVar145 * fVar126;
  fVar127 = fVar127 * (float)(auVar177._12_4_ >> 0x18) +
            fVar144 * (float)(auVar180._12_4_ >> 0x18) + fVar145 * (float)(auVar183._12_4_ >> 0x18);
  fVar313 = fVar312 * fVar146 + fVar164 * fVar162 + fVar194 * fVar163;
  fVar317 = fVar317 * fVar146 + fVar167 * fVar162 + fVar204 * fVar163;
  fVar318 = fVar318 * fVar146 + fVar168 * fVar162 + fVar205 * fVar163;
  fVar319 = (float)(auVar129._12_4_ >> 0x18) * fVar146 +
            (float)(auVar108._12_4_ >> 0x18) * fVar162 + (float)(auVar111._12_4_ >> 0x18) * fVar163;
  fVar237 = fVar75 * fVar146 + fVar206 * fVar162 + fVar237 * fVar163;
  fVar250 = fVar104 * fVar146 + fVar215 * fVar162 + fVar250 * fVar163;
  fVar253 = fVar105 * fVar146 + fVar216 * fVar162 + fVar253 * fVar163;
  fVar312 = (float)(auVar114._12_4_ >> 0x18) * fVar146 +
            (float)(auVar171._12_4_ >> 0x18) * fVar162 + (float)(auVar174._12_4_ >> 0x18) * fVar163;
  fVar221 = fVar146 * fVar221 + fVar162 * fVar258 + fVar163 * fVar106;
  fVar232 = fVar146 * fVar232 + fVar162 * fVar269 + fVar163 * fVar125;
  fVar234 = fVar146 * fVar234 + fVar162 * fVar272 + fVar163 * fVar126;
  fVar258 = fVar146 * (float)(auVar177._12_4_ >> 0x18) +
            fVar162 * (float)(auVar180._12_4_ >> 0x18) + fVar163 * (float)(auVar183._12_4_ >> 0x18);
  fVar145 = (float)DAT_01ff1d40;
  fVar75 = DAT_01ff1d40._4_4_;
  fVar104 = DAT_01ff1d40._8_4_;
  fVar105 = DAT_01ff1d40._12_4_;
  uVar69 = -(uint)(fVar145 <= ABS(fVar296));
  uVar70 = -(uint)(fVar75 <= ABS(fVar306));
  uVar72 = -(uint)(fVar104 <= ABS(fVar308));
  uVar73 = -(uint)(fVar105 <= ABS(fVar310));
  auVar298._0_4_ = (uint)fVar296 & uVar69;
  auVar298._4_4_ = (uint)fVar306 & uVar70;
  auVar298._8_4_ = (uint)fVar308 & uVar72;
  auVar298._12_4_ = (uint)fVar310 & uVar73;
  auVar147._0_4_ = ~uVar69 & (uint)fVar145;
  auVar147._4_4_ = ~uVar70 & (uint)fVar75;
  auVar147._8_4_ = ~uVar72 & (uint)fVar104;
  auVar147._12_4_ = ~uVar73 & (uint)fVar105;
  auVar147 = auVar147 | auVar298;
  uVar69 = -(uint)(fVar145 <= ABS(fVar280));
  uVar70 = -(uint)(fVar75 <= ABS(fVar290));
  uVar72 = -(uint)(fVar104 <= ABS(fVar292));
  uVar73 = -(uint)(fVar105 <= ABS(fVar294));
  auVar282._0_4_ = (uint)fVar280 & uVar69;
  auVar282._4_4_ = (uint)fVar290 & uVar70;
  auVar282._8_4_ = (uint)fVar292 & uVar72;
  auVar282._12_4_ = (uint)fVar294 & uVar73;
  auVar195._0_4_ = ~uVar69 & (uint)fVar145;
  auVar195._4_4_ = ~uVar70 & (uint)fVar75;
  auVar195._8_4_ = ~uVar72 & (uint)fVar104;
  auVar195._12_4_ = ~uVar73 & (uint)fVar105;
  auVar195 = auVar195 | auVar282;
  uVar69 = -(uint)(fVar145 <= ABS(fVar169));
  uVar70 = -(uint)(fVar75 <= ABS(fVar192));
  uVar72 = -(uint)(fVar104 <= ABS(fVar193));
  uVar73 = -(uint)(fVar105 <= ABS(fVar127));
  auVar185._0_4_ = (uint)fVar169 & uVar69;
  auVar185._4_4_ = (uint)fVar192 & uVar70;
  auVar185._8_4_ = (uint)fVar193 & uVar72;
  auVar185._12_4_ = (uint)fVar127 & uVar73;
  auVar207._0_4_ = ~uVar69 & (uint)fVar145;
  auVar207._4_4_ = ~uVar70 & (uint)fVar75;
  auVar207._8_4_ = ~uVar72 & (uint)fVar104;
  auVar207._12_4_ = ~uVar73 & (uint)fVar105;
  auVar207 = auVar207 | auVar185;
  auVar76 = rcpps(_DAT_01ff1d40,auVar147);
  fVar145 = auVar76._0_4_;
  fVar105 = auVar76._4_4_;
  fVar164 = auVar76._8_4_;
  fVar206 = auVar76._12_4_;
  fVar145 = (1.0 - auVar147._0_4_ * fVar145) * fVar145 + fVar145;
  fVar105 = (1.0 - auVar147._4_4_ * fVar105) * fVar105 + fVar105;
  fVar164 = (1.0 - auVar147._8_4_ * fVar164) * fVar164 + fVar164;
  fVar206 = (1.0 - auVar147._12_4_ * fVar206) * fVar206 + fVar206;
  auVar76 = rcpps(auVar76,auVar195);
  fVar75 = auVar76._0_4_;
  fVar106 = auVar76._4_4_;
  fVar167 = auVar76._8_4_;
  fVar215 = auVar76._12_4_;
  fVar75 = (1.0 - auVar195._0_4_ * fVar75) * fVar75 + fVar75;
  fVar106 = (1.0 - auVar195._4_4_ * fVar106) * fVar106 + fVar106;
  fVar167 = (1.0 - auVar195._8_4_ * fVar167) * fVar167 + fVar167;
  fVar215 = (1.0 - auVar195._12_4_ * fVar215) * fVar215 + fVar215;
  auVar76 = rcpps(auVar76,auVar207);
  fVar104 = auVar76._0_4_;
  fVar125 = auVar76._4_4_;
  fVar168 = auVar76._8_4_;
  fVar216 = auVar76._12_4_;
  fVar104 = (1.0 - auVar207._0_4_ * fVar104) * fVar104 + fVar104;
  fVar125 = (1.0 - auVar207._4_4_ * fVar125) * fVar125 + fVar125;
  fVar168 = (1.0 - auVar207._8_4_ * fVar168) * fVar168 + fVar168;
  fVar216 = (1.0 - auVar207._12_4_ * fVar216) * fVar216 + fVar216;
  fVar269 = ((ray->dir).field_0.m128[3] - *(float *)(prim + lVar21 + 0x16)) *
            *(float *)(prim + lVar21 + 0x1a);
  uVar64 = *(ulong *)(prim + uVar58 * 7 + 6);
  uVar103 = (undefined2)(uVar64 >> 0x30);
  auVar131._8_4_ = 0;
  auVar131._0_8_ = uVar64;
  auVar131._12_2_ = uVar103;
  auVar131._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar64 >> 0x20);
  auVar321._12_4_ = auVar131._12_4_;
  auVar321._8_2_ = 0;
  auVar321._0_8_ = uVar64;
  auVar321._10_2_ = uVar103;
  auVar77._10_6_ = auVar321._10_6_;
  auVar77._8_2_ = uVar103;
  auVar77._0_8_ = uVar64;
  uVar103 = (undefined2)(uVar64 >> 0x10);
  auVar44._4_8_ = auVar77._8_8_;
  auVar44._2_2_ = uVar103;
  auVar44._0_2_ = uVar103;
  fVar126 = (float)(auVar44._0_4_ >> 0x10);
  fVar169 = (float)(auVar77._8_4_ >> 0x10);
  uVar59 = *(ulong *)(prim + uVar58 * 0xb + 6);
  uVar103 = (undefined2)(uVar59 >> 0x30);
  auVar150._8_4_ = 0;
  auVar150._0_8_ = uVar59;
  auVar150._12_2_ = uVar103;
  auVar150._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar59 >> 0x20);
  auVar149._12_4_ = auVar150._12_4_;
  auVar149._8_2_ = 0;
  auVar149._0_8_ = uVar59;
  auVar149._10_2_ = uVar103;
  auVar148._10_6_ = auVar149._10_6_;
  auVar148._8_2_ = uVar103;
  auVar148._0_8_ = uVar59;
  uVar103 = (undefined2)(uVar59 >> 0x10);
  auVar45._4_8_ = auVar148._8_8_;
  auVar45._2_2_ = uVar103;
  auVar45._0_2_ = uVar103;
  uVar60 = *(ulong *)(prim + uVar58 * 9 + 6);
  uVar103 = (undefined2)(uVar60 >> 0x30);
  auVar80._8_4_ = 0;
  auVar80._0_8_ = uVar60;
  auVar80._12_2_ = uVar103;
  auVar80._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar60 >> 0x20);
  auVar79._12_4_ = auVar80._12_4_;
  auVar79._8_2_ = 0;
  auVar79._0_8_ = uVar60;
  auVar79._10_2_ = uVar103;
  auVar78._10_6_ = auVar79._10_6_;
  auVar78._8_2_ = uVar103;
  auVar78._0_8_ = uVar60;
  uVar103 = (undefined2)(uVar60 >> 0x10);
  auVar46._4_8_ = auVar78._8_8_;
  auVar46._2_2_ = uVar103;
  auVar46._0_2_ = uVar103;
  fVar127 = (float)(auVar46._0_4_ >> 0x10);
  fVar192 = (float)(auVar78._8_4_ >> 0x10);
  uVar61 = *(ulong *)(prim + uVar58 * 0xd + 6);
  uVar103 = (undefined2)(uVar61 >> 0x30);
  auVar210._8_4_ = 0;
  auVar210._0_8_ = uVar61;
  auVar210._12_2_ = uVar103;
  auVar210._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar61 >> 0x20);
  auVar209._12_4_ = auVar210._12_4_;
  auVar209._8_2_ = 0;
  auVar209._0_8_ = uVar61;
  auVar209._10_2_ = uVar103;
  auVar208._10_6_ = auVar209._10_6_;
  auVar208._8_2_ = uVar103;
  auVar208._0_8_ = uVar61;
  uVar103 = (undefined2)(uVar61 >> 0x10);
  auVar47._4_8_ = auVar208._8_8_;
  auVar47._2_2_ = uVar103;
  auVar47._0_2_ = uVar103;
  uVar65 = *(ulong *)(prim + uVar58 * 0x12 + 6);
  uVar103 = (undefined2)(uVar65 >> 0x30);
  auVar83._8_4_ = 0;
  auVar83._0_8_ = uVar65;
  auVar83._12_2_ = uVar103;
  auVar83._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar65 >> 0x20);
  auVar82._12_4_ = auVar83._12_4_;
  auVar82._8_2_ = 0;
  auVar82._0_8_ = uVar65;
  auVar82._10_2_ = uVar103;
  auVar81._10_6_ = auVar82._10_6_;
  auVar81._8_2_ = uVar103;
  auVar81._0_8_ = uVar65;
  uVar103 = (undefined2)(uVar65 >> 0x10);
  auVar48._4_8_ = auVar81._8_8_;
  auVar48._2_2_ = uVar103;
  auVar48._0_2_ = uVar103;
  fVar144 = (float)(auVar48._0_4_ >> 0x10);
  fVar193 = (float)(auVar81._8_4_ >> 0x10);
  uVar66 = (ulong)(uint)((int)(uVar58 * 5) << 2);
  uVar9 = *(ulong *)(prim + uVar58 * 2 + uVar66 + 6);
  uVar103 = (undefined2)(uVar9 >> 0x30);
  auVar242._8_4_ = 0;
  auVar242._0_8_ = uVar9;
  auVar242._12_2_ = uVar103;
  auVar242._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar9 >> 0x20);
  auVar241._12_4_ = auVar242._12_4_;
  auVar241._8_2_ = 0;
  auVar241._0_8_ = uVar9;
  auVar241._10_2_ = uVar103;
  auVar240._10_6_ = auVar241._10_6_;
  auVar240._8_2_ = uVar103;
  auVar240._0_8_ = uVar9;
  uVar103 = (undefined2)(uVar9 >> 0x10);
  auVar49._4_8_ = auVar240._8_8_;
  auVar49._2_2_ = uVar103;
  auVar49._0_2_ = uVar103;
  uVar66 = *(ulong *)(prim + uVar66 + 6);
  uVar103 = (undefined2)(uVar66 >> 0x30);
  auVar86._8_4_ = 0;
  auVar86._0_8_ = uVar66;
  auVar86._12_2_ = uVar103;
  auVar86._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar66 >> 0x20);
  auVar85._12_4_ = auVar86._12_4_;
  auVar85._8_2_ = 0;
  auVar85._0_8_ = uVar66;
  auVar85._10_2_ = uVar103;
  auVar84._10_6_ = auVar85._10_6_;
  auVar84._8_2_ = uVar103;
  auVar84._0_8_ = uVar66;
  uVar103 = (undefined2)(uVar66 >> 0x10);
  auVar50._4_8_ = auVar84._8_8_;
  auVar50._2_2_ = uVar103;
  auVar50._0_2_ = uVar103;
  fVar146 = (float)(auVar50._0_4_ >> 0x10);
  fVar194 = (float)(auVar84._8_4_ >> 0x10);
  uVar10 = *(ulong *)(prim + uVar58 * 0x18 + 6);
  uVar103 = (undefined2)(uVar10 >> 0x30);
  auVar263._8_4_ = 0;
  auVar263._0_8_ = uVar10;
  auVar263._12_2_ = uVar103;
  auVar263._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar10 >> 0x20);
  auVar262._12_4_ = auVar263._12_4_;
  auVar262._8_2_ = 0;
  auVar262._0_8_ = uVar10;
  auVar262._10_2_ = uVar103;
  auVar261._10_6_ = auVar262._10_6_;
  auVar261._8_2_ = uVar103;
  auVar261._0_8_ = uVar10;
  uVar103 = (undefined2)(uVar10 >> 0x10);
  auVar51._4_8_ = auVar261._8_8_;
  auVar51._2_2_ = uVar103;
  auVar51._0_2_ = uVar103;
  uVar11 = *(ulong *)(prim + uVar58 * 0x1d + 6);
  uVar103 = (undefined2)(uVar11 >> 0x30);
  auVar89._8_4_ = 0;
  auVar89._0_8_ = uVar11;
  auVar89._12_2_ = uVar103;
  auVar89._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar11 >> 0x20);
  auVar88._12_4_ = auVar89._12_4_;
  auVar88._8_2_ = 0;
  auVar88._0_8_ = uVar11;
  auVar88._10_2_ = uVar103;
  auVar87._10_6_ = auVar88._10_6_;
  auVar87._8_2_ = uVar103;
  auVar87._0_8_ = uVar11;
  uVar103 = (undefined2)(uVar11 >> 0x10);
  auVar52._4_8_ = auVar87._8_8_;
  auVar52._2_2_ = uVar103;
  auVar52._0_2_ = uVar103;
  fVar162 = (float)(auVar52._0_4_ >> 0x10);
  fVar204 = (float)(auVar87._8_4_ >> 0x10);
  uVar12 = *(ulong *)(prim + uVar58 + (ulong)(byte)PVar14 * 0x20 + 6);
  uVar103 = (undefined2)(uVar12 >> 0x30);
  auVar285._8_4_ = 0;
  auVar285._0_8_ = uVar12;
  auVar285._12_2_ = uVar103;
  auVar285._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar12 >> 0x20);
  auVar284._12_4_ = auVar285._12_4_;
  auVar284._8_2_ = 0;
  auVar284._0_8_ = uVar12;
  auVar284._10_2_ = uVar103;
  auVar283._10_6_ = auVar284._10_6_;
  auVar283._8_2_ = uVar103;
  auVar283._0_8_ = uVar12;
  uVar103 = (undefined2)(uVar12 >> 0x10);
  auVar53._4_8_ = auVar283._8_8_;
  auVar53._2_2_ = uVar103;
  auVar53._0_2_ = uVar103;
  uVar13 = *(ulong *)(prim + ((ulong)(byte)PVar14 * 0x20 - uVar58) + 6);
  uVar103 = (undefined2)(uVar13 >> 0x30);
  auVar92._8_4_ = 0;
  auVar92._0_8_ = uVar13;
  auVar92._12_2_ = uVar103;
  auVar92._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar13 >> 0x20);
  auVar91._12_4_ = auVar92._12_4_;
  auVar91._8_2_ = 0;
  auVar91._0_8_ = uVar13;
  auVar91._10_2_ = uVar103;
  auVar90._10_6_ = auVar91._10_6_;
  auVar90._8_2_ = uVar103;
  auVar90._0_8_ = uVar13;
  uVar103 = (undefined2)(uVar13 >> 0x10);
  auVar54._4_8_ = auVar90._8_8_;
  auVar54._2_2_ = uVar103;
  auVar54._0_2_ = uVar103;
  fVar163 = (float)(auVar54._0_4_ >> 0x10);
  fVar205 = (float)(auVar90._8_4_ >> 0x10);
  uVar58 = *(ulong *)(prim + uVar58 * 0x23 + 6);
  uVar103 = (undefined2)(uVar58 >> 0x30);
  auVar301._8_4_ = 0;
  auVar301._0_8_ = uVar58;
  auVar301._12_2_ = uVar103;
  auVar301._14_2_ = uVar103;
  uVar103 = (undefined2)(uVar58 >> 0x20);
  auVar300._12_4_ = auVar301._12_4_;
  auVar300._8_2_ = 0;
  auVar300._0_8_ = uVar58;
  auVar300._10_2_ = uVar103;
  auVar299._10_6_ = auVar300._10_6_;
  auVar299._8_2_ = uVar103;
  auVar299._0_8_ = uVar58;
  uVar103 = (undefined2)(uVar58 >> 0x10);
  auVar55._4_8_ = auVar299._8_8_;
  auVar55._2_2_ = uVar103;
  auVar55._0_2_ = uVar103;
  auVar151._0_8_ =
       CONCAT44(((((float)(auVar45._0_4_ >> 0x10) - fVar126) * fVar269 + fVar126) - fVar317) *
                fVar105,((((float)(int)(short)uVar59 - (float)(int)(short)uVar64) * fVar269 +
                         (float)(int)(short)uVar64) - fVar313) * fVar145);
  auVar151._8_4_ =
       ((((float)(auVar148._8_4_ >> 0x10) - fVar169) * fVar269 + fVar169) - fVar318) * fVar164;
  auVar151._12_4_ =
       ((((float)(auVar149._12_4_ >> 0x10) - (float)(auVar321._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar321._12_4_ >> 0x10)) - fVar319) * fVar206;
  auVar211._0_4_ =
       ((((float)(int)(short)uVar61 - (float)(int)(short)uVar60) * fVar269 +
        (float)(int)(short)uVar60) - fVar313) * fVar145;
  auVar211._4_4_ =
       ((((float)(auVar47._0_4_ >> 0x10) - fVar127) * fVar269 + fVar127) - fVar317) * fVar105;
  auVar211._8_4_ =
       ((((float)(auVar208._8_4_ >> 0x10) - fVar192) * fVar269 + fVar192) - fVar318) * fVar164;
  auVar211._12_4_ =
       ((((float)(auVar209._12_4_ >> 0x10) - (float)(auVar79._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar79._12_4_ >> 0x10)) - fVar319) * fVar206;
  auVar243._0_8_ =
       CONCAT44(((((float)(auVar49._0_4_ >> 0x10) - fVar144) * fVar269 + fVar144) - fVar250) *
                fVar106,((((float)(int)(short)uVar9 - (float)(int)(short)uVar65) * fVar269 +
                         (float)(int)(short)uVar65) - fVar237) * fVar75);
  auVar243._8_4_ =
       ((((float)(auVar240._8_4_ >> 0x10) - fVar193) * fVar269 + fVar193) - fVar253) * fVar167;
  auVar243._12_4_ =
       ((((float)(auVar241._12_4_ >> 0x10) - (float)(auVar82._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar82._12_4_ >> 0x10)) - fVar312) * fVar215;
  auVar264._0_4_ =
       ((((float)(int)(short)uVar10 - (float)(int)(short)uVar66) * fVar269 +
        (float)(int)(short)uVar66) - fVar237) * fVar75;
  auVar264._4_4_ =
       ((((float)(auVar51._0_4_ >> 0x10) - fVar146) * fVar269 + fVar146) - fVar250) * fVar106;
  auVar264._8_4_ =
       ((((float)(auVar261._8_4_ >> 0x10) - fVar194) * fVar269 + fVar194) - fVar253) * fVar167;
  auVar264._12_4_ =
       ((((float)(auVar262._12_4_ >> 0x10) - (float)(auVar85._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar85._12_4_ >> 0x10)) - fVar312) * fVar215;
  auVar286._0_8_ =
       CONCAT44(((((float)(auVar53._0_4_ >> 0x10) - fVar162) * fVar269 + fVar162) - fVar232) *
                fVar125,((((float)(int)(short)uVar12 - (float)(int)(short)uVar11) * fVar269 +
                         (float)(int)(short)uVar11) - fVar221) * fVar104);
  auVar286._8_4_ =
       ((((float)(auVar283._8_4_ >> 0x10) - fVar204) * fVar269 + fVar204) - fVar234) * fVar168;
  auVar286._12_4_ =
       ((((float)(auVar284._12_4_ >> 0x10) - (float)(auVar88._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar88._12_4_ >> 0x10)) - fVar258) * fVar216;
  auVar302._0_4_ =
       ((((float)(int)(short)uVar58 - (float)(int)(short)uVar13) * fVar269 +
        (float)(int)(short)uVar13) - fVar221) * fVar104;
  auVar302._4_4_ =
       ((((float)(auVar55._0_4_ >> 0x10) - fVar163) * fVar269 + fVar163) - fVar232) * fVar125;
  auVar302._8_4_ =
       ((((float)(auVar299._8_4_ >> 0x10) - fVar205) * fVar269 + fVar205) - fVar234) * fVar168;
  auVar302._12_4_ =
       ((((float)(auVar300._12_4_ >> 0x10) - (float)(auVar91._12_4_ >> 0x10)) * fVar269 +
        (float)(auVar91._12_4_ >> 0x10)) - fVar258) * fVar216;
  auVar128._8_4_ = auVar151._8_4_;
  auVar128._0_8_ = auVar151._0_8_;
  auVar128._12_4_ = auVar151._12_4_;
  auVar129 = minps(auVar128,auVar211);
  auVar93._8_4_ = auVar243._8_4_;
  auVar93._0_8_ = auVar243._0_8_;
  auVar93._12_4_ = auVar243._12_4_;
  auVar76 = minps(auVar93,auVar264);
  auVar129 = maxps(auVar129,auVar76);
  auVar94._8_4_ = auVar286._8_4_;
  auVar94._0_8_ = auVar286._0_8_;
  auVar94._12_4_ = auVar286._12_4_;
  auVar76 = minps(auVar94,auVar302);
  uVar15 = *(undefined4 *)((long)&(ray->org).field_0 + 0xc);
  auVar116._4_4_ = uVar15;
  auVar116._0_4_ = uVar15;
  auVar116._8_4_ = uVar15;
  auVar116._12_4_ = uVar15;
  auVar76 = maxps(auVar76,auVar116);
  auVar76 = maxps(auVar129,auVar76);
  local_178 = auVar76._0_4_ * 0.99999964;
  fStack_174 = auVar76._4_4_ * 0.99999964;
  fStack_170 = auVar76._8_4_ * 0.99999964;
  fStack_16c = auVar76._12_4_ * 0.99999964;
  auVar76 = maxps(auVar151,auVar211);
  auVar129 = maxps(auVar243,auVar264);
  auVar76 = minps(auVar76,auVar129);
  auVar129 = maxps(auVar286,auVar302);
  fVar145 = ray->tfar;
  auVar95._4_4_ = fVar145;
  auVar95._0_4_ = fVar145;
  auVar95._8_4_ = fVar145;
  auVar95._12_4_ = fVar145;
  auVar129 = minps(auVar129,auVar95);
  auVar76 = minps(auVar76,auVar129);
  uVar69 = (uint)(byte)PVar14;
  auVar117._0_4_ = -(uint)(uVar69 != 0 && local_178 <= auVar76._0_4_ * 1.0000004);
  auVar117._4_4_ = -(uint)(1 < uVar69 && fStack_174 <= auVar76._4_4_ * 1.0000004);
  auVar117._8_4_ = -(uint)(2 < uVar69 && fStack_170 <= auVar76._8_4_ * 1.0000004);
  auVar117._12_4_ = -(uint)(3 < uVar69 && fStack_16c <= auVar76._12_4_ * 1.0000004);
  uVar69 = movmskps(uVar69,auVar117);
  local_43d = uVar69 != 0;
  if (uVar69 == 0) {
    return local_43d;
  }
  uVar69 = uVar69 & 0xff;
  local_168._0_12_ = mm_lookupmask_ps._240_12_;
  local_168._12_4_ = 0;
  local_2f8 = prim;
LAB_00bd051d:
  lVar21 = 0;
  if ((ulong)uVar69 != 0) {
    for (; (uVar69 >> lVar21 & 1) == 0; lVar21 = lVar21 + 1) {
    }
  }
  local_360 = (ulong)*(uint *)(local_2f8 + 2);
  uVar70 = *(uint *)(local_2f8 + lVar21 * 4 + 6);
  pGVar16 = (context->scene->geometries).items[local_360].ptr;
  fVar145 = pGVar16->fnumTimeSegments;
  fVar75 = (pGVar16->time_range).lower;
  fVar104 = (((ray->dir).field_0.m128[3] - fVar75) / ((pGVar16->time_range).upper - fVar75)) *
            fVar145;
  fVar75 = floorf(fVar104);
  fVar145 = fVar145 + -1.0;
  if (fVar145 <= fVar75) {
    fVar75 = fVar145;
  }
  fVar145 = 0.0;
  if (0.0 <= fVar75) {
    fVar145 = fVar75;
  }
  fVar104 = fVar104 - fVar145;
  uVar59 = (ulong)*(uint *)(*(long *)&pGVar16->field_0x58 +
                           (ulong)uVar70 *
                           pGVar16[1].super_RefCount.refCounter.super___atomic_base<unsigned_long>.
                           _M_i);
  _Var17 = pGVar16[4].super_RefCount.refCounter.super___atomic_base<unsigned_long>._M_i;
  lVar67 = (long)(int)fVar145 * 0x38;
  lVar18 = *(long *)(_Var17 + lVar67);
  lVar19 = *(long *)(_Var17 + 0x10 + lVar67);
  pfVar3 = (float *)(lVar18 + lVar19 * uVar59);
  fVar145 = *pfVar3;
  fVar75 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  lVar21 = uVar59 + 1;
  pfVar3 = (float *)(lVar18 + lVar19 * lVar21);
  lVar1 = uVar59 + 2;
  pfVar4 = (float *)(lVar18 + lVar19 * lVar1);
  lVar2 = uVar59 + 3;
  pfVar5 = (float *)(lVar18 + lVar19 * lVar2);
  fVar125 = *pfVar5;
  fVar126 = pfVar5[1];
  fVar127 = pfVar5[2];
  fVar144 = pfVar5[3];
  lVar18 = *(long *)&pGVar16[4].fnumTimeSegments;
  lVar19 = *(long *)(lVar18 + lVar67);
  lVar20 = *(long *)(lVar18 + 0x10 + lVar67);
  pfVar5 = (float *)(lVar19 + lVar20 * uVar59);
  fVar146 = *pfVar5;
  fVar162 = pfVar5[1];
  fVar163 = pfVar5[2];
  fVar164 = pfVar5[3];
  pfVar5 = (float *)(lVar19 + lVar20 * lVar21);
  pfVar6 = (float *)(lVar19 + lVar20 * lVar1);
  pfVar7 = (float *)(lVar19 + lVar20 * lVar2);
  fVar167 = *pfVar7;
  fVar168 = pfVar7[1];
  fVar169 = pfVar7[2];
  fVar192 = pfVar7[3];
  fVar194 = *pfVar4 * 0.0;
  fVar205 = pfVar4[1] * 0.0;
  fVar215 = pfVar4[2] * 0.0;
  fVar237 = pfVar4[3] * 0.0;
  fVar193 = fVar125 * 0.0 + fVar194;
  fVar204 = fVar126 * 0.0 + fVar205;
  fVar206 = fVar127 * 0.0 + fVar215;
  fVar216 = fVar144 * 0.0 + fVar237;
  fVar310 = *pfVar3 * 0.0;
  fVar317 = pfVar3[1] * 0.0;
  fVar319 = pfVar3[2] * 0.0;
  fVar276 = pfVar3[3] * 0.0;
  fVar272 = fVar310 + fVar193 + fVar145;
  fVar280 = fVar317 + fVar204 + fVar75;
  fVar290 = fVar319 + fVar206 + fVar105;
  fVar292 = fVar276 + fVar216 + fVar106;
  fVar193 = (*pfVar3 * 3.0 + fVar193) - fVar145 * 3.0;
  fVar204 = (pfVar3[1] * 3.0 + fVar204) - fVar75 * 3.0;
  fVar206 = (pfVar3[2] * 3.0 + fVar206) - fVar105 * 3.0;
  fVar216 = (pfVar3[3] * 3.0 + fVar216) - fVar106 * 3.0;
  fVar313 = *pfVar6 * 0.0;
  fVar318 = pfVar6[1] * 0.0;
  fVar273 = pfVar6[2] * 0.0;
  fVar277 = pfVar6[3] * 0.0;
  fVar250 = fVar167 * 0.0 + fVar313;
  fVar253 = fVar168 * 0.0 + fVar318;
  fVar312 = fVar169 * 0.0 + fVar273;
  fVar221 = fVar192 * 0.0 + fVar277;
  fVar281 = *pfVar5 * 0.0;
  fVar291 = pfVar5[1] * 0.0;
  fVar293 = pfVar5[2] * 0.0;
  fVar295 = pfVar5[3] * 0.0;
  fVar297 = fVar281 + fVar250 + fVar146;
  fVar307 = fVar291 + fVar253 + fVar162;
  fVar309 = fVar293 + fVar312 + fVar163;
  fVar311 = fVar295 + fVar221 + fVar164;
  fVar294 = (*pfVar5 * 3.0 + fVar250) - fVar146 * 3.0;
  fVar296 = (pfVar5[1] * 3.0 + fVar253) - fVar162 * 3.0;
  fVar306 = (pfVar5[2] * 3.0 + fVar312) - fVar163 * 3.0;
  fVar308 = (pfVar5[3] * 3.0 + fVar221) - fVar164 * 3.0;
  fVar232 = fVar194 + fVar125 + fVar310 + fVar145 * 0.0;
  fVar234 = fVar205 + fVar126 + fVar317 + fVar75 * 0.0;
  fVar258 = fVar215 + fVar127 + fVar319 + fVar105 * 0.0;
  fVar269 = fVar237 + fVar144 + fVar276 + fVar106 * 0.0;
  fVar250 = ((fVar125 * 3.0 - *pfVar4 * 3.0) + fVar310) - fVar145 * 0.0;
  fVar253 = ((fVar126 * 3.0 - pfVar4[1] * 3.0) + fVar317) - fVar75 * 0.0;
  fVar312 = ((fVar127 * 3.0 - pfVar4[2] * 3.0) + fVar319) - fVar105 * 0.0;
  fVar221 = ((fVar144 * 3.0 - pfVar4[3] * 3.0) + fVar276) - fVar106 * 0.0;
  fVar125 = fVar313 + fVar167 + fVar281 + fVar146 * 0.0;
  fVar126 = fVar318 + fVar168 + fVar291 + fVar162 * 0.0;
  fVar127 = fVar273 + fVar169 + fVar293 + fVar163 * 0.0;
  fVar194 = fVar277 + fVar192 + fVar295 + fVar164 * 0.0;
  fVar145 = ((fVar167 * 3.0 - *pfVar6 * 3.0) + fVar281) - fVar146 * 0.0;
  fVar75 = ((fVar168 * 3.0 - pfVar6[1] * 3.0) + fVar291) - fVar162 * 0.0;
  fVar105 = ((fVar169 * 3.0 - pfVar6[2] * 3.0) + fVar293) - fVar163 * 0.0;
  fVar106 = ((fVar192 * 3.0 - pfVar6[3] * 3.0) + fVar295) - fVar164 * 0.0;
  fVar205 = fVar204 * fVar297 - fVar307 * fVar193;
  fVar237 = fVar206 * fVar307 - fVar309 * fVar204;
  fVar310 = fVar193 * fVar309 - fVar297 * fVar206;
  fVar313 = fVar216 * fVar311 - fVar311 * fVar216;
  fVar167 = fVar204 * fVar294 - fVar296 * fVar193;
  fVar169 = fVar206 * fVar296 - fVar306 * fVar204;
  fVar192 = fVar193 * fVar306 - fVar294 * fVar206;
  fVar144 = fVar253 * fVar125 - fVar126 * fVar250;
  fVar162 = fVar312 * fVar126 - fVar127 * fVar253;
  fVar163 = fVar250 * fVar127 - fVar125 * fVar312;
  fVar164 = fVar221 * fVar194 - fVar194 * fVar221;
  fVar125 = fVar253 * fVar145 - fVar75 * fVar250;
  fVar126 = fVar312 * fVar75 - fVar105 * fVar253;
  fVar105 = fVar250 * fVar105 - fVar145 * fVar312;
  fVar194 = fVar310 * fVar310 + fVar237 * fVar237 + fVar205 * fVar205;
  auVar129 = ZEXT416((uint)fVar194);
  auVar76 = rsqrtss(ZEXT416((uint)fVar194),auVar129);
  fVar145 = auVar76._0_4_;
  fVar215 = fVar145 * 1.5 - fVar145 * fVar145 * fVar194 * 0.5 * fVar145;
  fVar294 = fVar205 * fVar167 + fVar310 * fVar192 + fVar237 * fVar169;
  fVar145 = fVar313 * fVar215;
  auVar76 = rcpss(auVar129,auVar129);
  fVar168 = (2.0 - fVar194 * auVar76._0_4_) * auVar76._0_4_;
  fVar296 = fVar163 * fVar163 + fVar162 * fVar162 + fVar144 * fVar144;
  auVar76 = ZEXT416((uint)fVar296);
  auVar129 = rsqrtss(ZEXT416((uint)fVar296),auVar76);
  fVar75 = auVar129._0_4_;
  fVar146 = fVar75 * 1.5 - fVar75 * fVar75 * fVar296 * 0.5 * fVar75;
  fVar306 = fVar144 * fVar125 + fVar163 * fVar105 + fVar162 * fVar126;
  fVar127 = fVar164 * fVar146;
  auVar76 = rcpss(auVar76,auVar76);
  fVar75 = (2.0 - fVar296 * auVar76._0_4_) * auVar76._0_4_;
  fVar297 = fVar292 * fVar237 * fVar215;
  fVar311 = fVar292 * fVar310 * fVar215;
  fVar217 = fVar292 * fVar205 * fVar215;
  fVar219 = fVar292 * fVar145;
  fVar259 = fVar272 - fVar297;
  fVar270 = fVar280 - fVar311;
  fVar274 = fVar290 - fVar217;
  fVar278 = fVar292 - fVar219;
  fVar238 = fVar292 * fVar168 * (fVar194 * fVar169 - fVar294 * fVar237) * fVar215 +
            fVar216 * fVar237 * fVar215;
  fVar251 = fVar292 * fVar168 * (fVar194 * fVar192 - fVar294 * fVar310) * fVar215 +
            fVar216 * fVar310 * fVar215;
  fVar254 = fVar292 * fVar168 * (fVar194 * fVar167 - fVar294 * fVar205) * fVar215 +
            fVar216 * fVar205 * fVar215;
  fVar256 = fVar292 * fVar168 * (fVar194 * (fVar216 * fVar308 - fVar308 * fVar216) -
                                fVar294 * fVar313) * fVar215 + fVar216 * fVar145;
  fVar297 = fVar297 + fVar272;
  fVar311 = fVar311 + fVar280;
  fVar217 = fVar217 + fVar290;
  fVar219 = fVar219 + fVar292;
  fVar194 = fVar269 * fVar162 * fVar146;
  fVar205 = fVar269 * fVar163 * fVar146;
  fVar215 = fVar269 * fVar144 * fVar146;
  fVar237 = fVar269 * fVar127;
  fVar310 = fVar232 - fVar194;
  fVar318 = fVar234 - fVar205;
  fVar276 = fVar258 - fVar215;
  fVar291 = fVar269 - fVar237;
  fVar272 = fVar269 * fVar75 * (fVar296 * fVar126 - fVar306 * fVar162) * fVar146 +
            fVar221 * fVar162 * fVar146;
  fVar290 = fVar269 * fVar75 * (fVar296 * fVar105 - fVar306 * fVar163) * fVar146 +
            fVar221 * fVar163 * fVar146;
  fVar294 = fVar269 * fVar75 * (fVar296 * fVar125 - fVar306 * fVar144) * fVar146 +
            fVar221 * fVar144 * fVar146;
  fVar306 = fVar269 * fVar75 * (fVar296 * (fVar221 * fVar106 - fVar106 * fVar221) -
                               fVar306 * fVar164) * fVar146 + fVar221 * fVar127;
  fVar194 = fVar194 + fVar232;
  fVar205 = fVar205 + fVar234;
  fVar215 = fVar215 + fVar258;
  fVar237 = fVar237 + fVar269;
  lVar19 = *(long *)(_Var17 + 0x38 + lVar67);
  lVar20 = *(long *)(_Var17 + 0x48 + lVar67);
  pfVar3 = (float *)(lVar19 + lVar20 * uVar59);
  fVar145 = *pfVar3;
  fVar75 = pfVar3[1];
  fVar105 = pfVar3[2];
  fVar106 = pfVar3[3];
  pfVar3 = (float *)(lVar19 + lVar20 * lVar21);
  pfVar4 = (float *)(lVar19 + lVar20 * lVar1);
  pfVar5 = (float *)(lVar19 + lVar20 * lVar2);
  fVar125 = *pfVar5;
  fVar126 = pfVar5[1];
  fVar127 = pfVar5[2];
  fVar144 = pfVar5[3];
  lVar19 = *(long *)(lVar18 + 0x38 + lVar67);
  lVar18 = *(long *)(lVar18 + 0x48 + lVar67);
  uVar64 = lVar21 * lVar18;
  pfVar5 = (float *)(lVar19 + lVar18 * lVar2);
  fVar146 = *pfVar5;
  fVar162 = pfVar5[1];
  fVar163 = pfVar5[2];
  fVar164 = pfVar5[3];
  fVar280 = *pfVar4 * 0.0;
  fVar292 = pfVar4[1] * 0.0;
  fVar296 = pfVar4[2] * 0.0;
  fVar308 = pfVar4[3] * 0.0;
  fVar317 = fVar125 * 0.0 + fVar280;
  fVar273 = fVar126 * 0.0 + fVar292;
  fVar281 = fVar127 * 0.0 + fVar296;
  fVar295 = fVar144 * 0.0 + fVar308;
  fVar313 = *pfVar3 * 0.0;
  fVar319 = pfVar3[1] * 0.0;
  fVar277 = pfVar3[2] * 0.0;
  fVar293 = pfVar3[3] * 0.0;
  fVar232 = (*pfVar3 * 3.0 + fVar317) - fVar145 * 3.0;
  fVar234 = (pfVar3[1] * 3.0 + fVar273) - fVar75 * 3.0;
  fVar258 = (pfVar3[2] * 3.0 + fVar281) - fVar105 * 3.0;
  fVar269 = (pfVar3[3] * 3.0 + fVar295) - fVar106 * 3.0;
  pfVar3 = (float *)(lVar19 + lVar1 * lVar18);
  fVar239 = *pfVar3 * 0.0;
  fVar252 = pfVar3[1] * 0.0;
  fVar255 = pfVar3[2] * 0.0;
  fVar257 = pfVar3[3] * 0.0;
  fVar222 = fVar146 * 0.0 + fVar239;
  fVar233 = fVar162 * 0.0 + fVar252;
  fVar235 = fVar163 * 0.0 + fVar255;
  fVar236 = fVar164 * 0.0 + fVar257;
  pfVar5 = (float *)(lVar19 + uVar64);
  fVar260 = *pfVar5 * 0.0;
  fVar271 = pfVar5[1] * 0.0;
  fVar275 = pfVar5[2] * 0.0;
  fVar279 = pfVar5[3] * 0.0;
  pfVar6 = (float *)(lVar19 + uVar59 * lVar18);
  fVar167 = *pfVar6;
  fVar168 = pfVar6[1];
  fVar169 = pfVar6[2];
  fVar192 = pfVar6[3];
  fVar307 = (*pfVar5 * 3.0 + fVar222) - fVar167 * 3.0;
  fVar309 = (pfVar5[1] * 3.0 + fVar233) - fVar168 * 3.0;
  fVar218 = (pfVar5[2] * 3.0 + fVar235) - fVar169 * 3.0;
  fVar220 = (pfVar5[3] * 3.0 + fVar236) - fVar192 * 3.0;
  fVar317 = fVar313 + fVar317 + fVar145;
  fVar273 = fVar319 + fVar273 + fVar75;
  fVar281 = fVar277 + fVar281 + fVar105;
  fVar295 = fVar293 + fVar295 + fVar106;
  fVar280 = fVar280 + fVar125 + fVar313 + fVar145 * 0.0;
  fVar292 = fVar292 + fVar126 + fVar319 + fVar75 * 0.0;
  fVar296 = fVar296 + fVar127 + fVar277 + fVar105 * 0.0;
  fVar308 = fVar308 + fVar144 + fVar293 + fVar106 * 0.0;
  fVar145 = ((fVar125 * 3.0 - *pfVar4 * 3.0) + fVar313) - fVar145 * 0.0;
  fVar75 = ((fVar126 * 3.0 - pfVar4[1] * 3.0) + fVar319) - fVar75 * 0.0;
  fVar105 = ((fVar127 * 3.0 - pfVar4[2] * 3.0) + fVar277) - fVar105 * 0.0;
  fVar106 = ((fVar144 * 3.0 - pfVar4[3] * 3.0) + fVar293) - fVar106 * 0.0;
  fVar144 = fVar260 + fVar222 + fVar167;
  fVar222 = fVar271 + fVar233 + fVar168;
  fVar233 = fVar275 + fVar235 + fVar169;
  fVar235 = fVar279 + fVar236 + fVar192;
  fVar313 = fVar239 + fVar146 + fVar260 + fVar167 * 0.0;
  fVar319 = fVar252 + fVar162 + fVar271 + fVar168 * 0.0;
  fVar277 = fVar255 + fVar163 + fVar275 + fVar169 * 0.0;
  fVar293 = fVar257 + fVar164 + fVar279 + fVar192 * 0.0;
  fVar125 = ((fVar146 * 3.0 - *pfVar3 * 3.0) + fVar260) - fVar167 * 0.0;
  fVar126 = ((fVar162 * 3.0 - pfVar3[1] * 3.0) + fVar271) - fVar168 * 0.0;
  fVar127 = ((fVar163 * 3.0 - pfVar3[2] * 3.0) + fVar275) - fVar169 * 0.0;
  fVar164 = ((fVar164 * 3.0 - pfVar3[3] * 3.0) + fVar279) - fVar192 * 0.0;
  fVar163 = fVar234 * fVar144 - fVar222 * fVar232;
  fVar167 = fVar258 * fVar222 - fVar233 * fVar234;
  fVar233 = fVar232 * fVar233 - fVar144 * fVar258;
  fVar236 = fVar269 * fVar235 - fVar235 * fVar269;
  fVar144 = fVar234 * fVar307 - fVar309 * fVar232;
  fVar146 = fVar258 * fVar309 - fVar218 * fVar234;
  fVar162 = fVar232 * fVar218 - fVar307 * fVar258;
  fVar307 = fVar75 * fVar313 - fVar319 * fVar145;
  fVar218 = fVar105 * fVar319 - fVar277 * fVar75;
  fVar222 = fVar145 * fVar277 - fVar313 * fVar105;
  fVar235 = fVar106 * fVar293 - fVar293 * fVar106;
  fVar168 = fVar75 * fVar125 - fVar126 * fVar145;
  fVar192 = fVar105 * fVar126 - fVar127 * fVar75;
  fVar319 = fVar145 * fVar127 - fVar125 * fVar105;
  fVar125 = fVar233 * fVar233 + fVar167 * fVar167 + fVar163 * fVar163;
  auVar76 = ZEXT416((uint)fVar125);
  auVar129 = rsqrtss(ZEXT416((uint)fVar125),auVar76);
  fVar126 = auVar129._0_4_;
  fVar309 = fVar126 * 1.5 - fVar126 * fVar126 * fVar125 * 0.5 * fVar126;
  fVar257 = fVar163 * fVar144 + fVar233 * fVar162 + fVar167 * fVar146;
  auVar76 = rcpss(auVar76,auVar76);
  fVar126 = (2.0 - fVar125 * auVar76._0_4_) * auVar76._0_4_;
  fVar127 = fVar236 * fVar309;
  fVar239 = fVar222 * fVar222 + fVar218 * fVar218 + fVar307 * fVar307;
  auVar76 = ZEXT416((uint)fVar239);
  auVar129 = rsqrtss(ZEXT416((uint)fVar239),auVar76);
  fVar169 = auVar129._0_4_;
  fVar255 = fVar169 * 1.5 - fVar169 * fVar169 * fVar239 * 0.5 * fVar169;
  fVar260 = fVar307 * fVar168 + fVar222 * fVar319 + fVar218 * fVar192;
  auVar76 = rcpss(auVar76,auVar76);
  fVar271 = (2.0 - fVar239 * auVar76._0_4_) * auVar76._0_4_;
  fVar252 = fVar235 * fVar255;
  fVar169 = fVar295 * fVar167 * fVar309;
  fVar313 = fVar295 * fVar233 * fVar309;
  fVar277 = fVar295 * fVar163 * fVar309;
  fVar293 = fVar295 * fVar127;
  fVar146 = fVar295 * fVar126 * (fVar125 * fVar146 - fVar257 * fVar167) * fVar309 +
            fVar269 * fVar167 * fVar309;
  fVar162 = fVar295 * fVar126 * (fVar125 * fVar162 - fVar257 * fVar233) * fVar309 +
            fVar269 * fVar233 * fVar309;
  fVar163 = fVar295 * fVar126 * (fVar125 * fVar144 - fVar257 * fVar163) * fVar309 +
            fVar269 * fVar163 * fVar309;
  fVar167 = fVar295 * fVar126 * (fVar125 * (fVar269 * fVar220 - fVar220 * fVar269) -
                                fVar257 * fVar236) * fVar309 + fVar269 * fVar127;
  fVar309 = fVar317 - fVar169;
  fVar220 = fVar273 - fVar313;
  fVar233 = fVar281 - fVar277;
  fVar236 = fVar295 - fVar293;
  fVar169 = fVar169 + fVar317;
  fVar313 = fVar313 + fVar273;
  fVar277 = fVar277 + fVar281;
  fVar293 = fVar293 + fVar295;
  fVar125 = fVar308 * fVar218 * fVar255;
  fVar126 = fVar308 * fVar222 * fVar255;
  fVar127 = fVar308 * fVar307 * fVar255;
  fVar144 = fVar308 * fVar252;
  fVar273 = fVar308 * fVar271 * (fVar239 * fVar192 - fVar260 * fVar218) * fVar255 +
            fVar106 * fVar218 * fVar255;
  fVar319 = fVar308 * fVar271 * (fVar239 * fVar319 - fVar260 * fVar222) * fVar255 +
            fVar106 * fVar222 * fVar255;
  fVar281 = fVar308 * fVar271 * (fVar239 * fVar168 - fVar260 * fVar307) * fVar255 +
            fVar106 * fVar307 * fVar255;
  fVar295 = fVar308 * fVar271 * (fVar239 * (fVar106 * fVar164 - fVar164 * fVar106) -
                                fVar260 * fVar235) * fVar255 + fVar106 * fVar252;
  fVar164 = fVar280 - fVar125;
  fVar168 = fVar292 - fVar126;
  fVar192 = fVar296 - fVar127;
  fVar317 = fVar308 - fVar144;
  fVar125 = fVar125 + fVar280;
  fVar126 = fVar126 + fVar292;
  fVar127 = fVar127 + fVar296;
  fVar144 = fVar144 + fVar308;
  fVar280 = 1.0 - fVar104;
  local_398 = fVar259 * fVar280 + fVar309 * fVar104;
  fStack_394 = fVar270 * fVar280 + fVar220 * fVar104;
  fStack_390 = fVar274 * fVar280 + fVar233 * fVar104;
  fStack_38c = fVar278 * fVar280 + fVar236 * fVar104;
  local_3a8 = ((fVar193 - fVar238) * 0.33333334 + fVar259) * fVar280 +
              ((fVar232 - fVar146) * 0.33333334 + fVar309) * fVar104;
  fStack_3a4 = ((fVar204 - fVar251) * 0.33333334 + fVar270) * fVar280 +
               ((fVar234 - fVar162) * 0.33333334 + fVar220) * fVar104;
  fStack_3a0 = ((fVar206 - fVar254) * 0.33333334 + fVar274) * fVar280 +
               ((fVar258 - fVar163) * 0.33333334 + fVar233) * fVar104;
  fStack_39c = ((fVar216 - fVar256) * 0.33333334 + fVar278) * fVar280 +
               ((fVar269 - fVar167) * 0.33333334 + fVar236) * fVar104;
  local_3c8 = (fVar310 - (fVar250 - fVar272) * 0.33333334) * fVar280 +
              (fVar164 - (fVar145 - fVar273) * 0.33333334) * fVar104;
  fStack_3c4 = (fVar318 - (fVar253 - fVar290) * 0.33333334) * fVar280 +
               (fVar168 - (fVar75 - fVar319) * 0.33333334) * fVar104;
  fStack_3c0 = (fVar276 - (fVar312 - fVar294) * 0.33333334) * fVar280 +
               (fVar192 - (fVar105 - fVar281) * 0.33333334) * fVar104;
  fStack_3bc = (fVar291 - (fVar221 - fVar306) * 0.33333334) * fVar280 +
               (fVar317 - (fVar106 - fVar295) * 0.33333334) * fVar104;
  local_3b8 = fVar310 * fVar280 + fVar164 * fVar104;
  fStack_3b4 = fVar318 * fVar280 + fVar168 * fVar104;
  fStack_3b0 = fVar276 * fVar280 + fVar192 * fVar104;
  fStack_3ac = fVar291 * fVar280 + fVar317 * fVar104;
  local_388 = fVar297 * fVar280 + fVar169 * fVar104;
  fStack_384 = fVar311 * fVar280 + fVar313 * fVar104;
  fStack_380 = fVar217 * fVar280 + fVar277 * fVar104;
  fStack_37c = fVar219 * fVar280 + fVar293 * fVar104;
  local_3d8 = ((fVar238 + fVar193) * 0.33333334 + fVar297) * fVar280 +
              ((fVar146 + fVar232) * 0.33333334 + fVar169) * fVar104;
  fStack_3d4 = ((fVar251 + fVar204) * 0.33333334 + fVar311) * fVar280 +
               ((fVar162 + fVar234) * 0.33333334 + fVar313) * fVar104;
  fStack_3d0 = ((fVar254 + fVar206) * 0.33333334 + fVar217) * fVar280 +
               ((fVar163 + fVar258) * 0.33333334 + fVar277) * fVar104;
  fStack_3cc = ((fVar256 + fVar216) * 0.33333334 + fVar219) * fVar280 +
               ((fVar167 + fVar269) * 0.33333334 + fVar293) * fVar104;
  local_3e8 = (fVar194 - (fVar272 + fVar250) * 0.33333334) * fVar280 +
              (fVar125 - (fVar273 + fVar145) * 0.33333334) * fVar104;
  fStack_3e4 = (fVar205 - (fVar290 + fVar253) * 0.33333334) * fVar280 +
               (fVar126 - (fVar319 + fVar75) * 0.33333334) * fVar104;
  fStack_3e0 = (fVar215 - (fVar294 + fVar312) * 0.33333334) * fVar280 +
               (fVar127 - (fVar281 + fVar105) * 0.33333334) * fVar104;
  fStack_3dc = (fVar237 - (fVar306 + fVar221) * 0.33333334) * fVar280 +
               (fVar144 - (fVar295 + fVar106) * 0.33333334) * fVar104;
  local_2b8 = fVar280 * fVar194 + fVar104 * fVar125;
  fStack_2b4 = fVar280 * fVar205 + fVar104 * fVar126;
  fStack_2b0 = fVar280 * fVar215 + fVar104 * fVar127;
  fStack_2ac = fVar280 * fVar237 + fVar104 * fVar144;
  fVar145 = (ray->org).field_0.m128[0];
  fVar75 = (ray->org).field_0.m128[1];
  fVar104 = (ray->org).field_0.m128[2];
  fVar105 = (pre->ray_space).vx.field_0.m128[0];
  fVar106 = (pre->ray_space).vx.field_0.m128[1];
  fVar125 = (pre->ray_space).vy.field_0.m128[0];
  fVar126 = (pre->ray_space).vy.field_0.m128[1];
  fVar127 = (pre->ray_space).vz.field_0.m128[0];
  fVar144 = (pre->ray_space).vz.field_0.m128[1];
  local_318 = (local_398 - fVar145) * fVar105 +
              (fStack_394 - fVar75) * fVar125 + (fStack_390 - fVar104) * fVar127;
  fStack_314 = (local_398 - fVar145) * fVar106 +
               (fStack_394 - fVar75) * fVar126 + (fStack_390 - fVar104) * fVar144;
  local_208 = CONCAT44(fStack_314,local_318);
  fVar163 = (local_3a8 - fVar145) * fVar105 +
            (fStack_3a4 - fVar75) * fVar125 + (fStack_3a0 - fVar104) * fVar127;
  fVar164 = (local_3a8 - fVar145) * fVar106 +
            (fStack_3a4 - fVar75) * fVar126 + (fStack_3a0 - fVar104) * fVar144;
  local_218 = CONCAT44(fVar164,fVar163);
  fVar146 = (local_3c8 - fVar145) * fVar105 +
            (fStack_3c4 - fVar75) * fVar125 + (fStack_3c0 - fVar104) * fVar127;
  fVar162 = (local_3c8 - fVar145) * fVar106 +
            (fStack_3c4 - fVar75) * fVar126 + (fStack_3c0 - fVar104) * fVar144;
  local_338 = CONCAT44(fVar162,fVar146);
  fVar167 = (local_3b8 - fVar145) * fVar105 +
            (fStack_3b4 - fVar75) * fVar125 + (fStack_3b0 - fVar104) * fVar127;
  fVar168 = (local_3b8 - fVar145) * fVar106 +
            (fStack_3b4 - fVar75) * fVar126 + (fStack_3b0 - fVar104) * fVar144;
  local_238 = CONCAT44(fVar168,fVar167);
  fStack_310 = (local_388 - fVar145) * fVar105 +
               (fStack_384 - fVar75) * fVar125 + (fStack_380 - fVar104) * fVar127;
  fStack_30c = (local_388 - fVar145) * fVar106 +
               (fStack_384 - fVar75) * fVar126 + (fStack_380 - fVar104) * fVar144;
  local_248 = CONCAT44(fStack_30c,fStack_310);
  fVar169 = (local_3d8 - fVar145) * fVar105 +
            (fStack_3d4 - fVar75) * fVar125 + (fStack_3d0 - fVar104) * fVar127;
  fVar192 = (local_3d8 - fVar145) * fVar106 +
            (fStack_3d4 - fVar75) * fVar126 + (fStack_3d0 - fVar104) * fVar144;
  local_258 = CONCAT44(fVar192,fVar169);
  fVar193 = (local_3e8 - fVar145) * fVar105 +
            (fStack_3e4 - fVar75) * fVar125 + (fStack_3e0 - fVar104) * fVar127;
  fVar194 = (local_3e8 - fVar145) * fVar106 +
            (fStack_3e4 - fVar75) * fVar126 + (fStack_3e0 - fVar104) * fVar144;
  uStack_330 = CONCAT44(fVar194,fVar193);
  fVar105 = (local_2b8 - fVar145) * fVar105 +
            (fStack_2b4 - fVar75) * fVar125 + (fStack_2b0 - fVar104) * fVar127;
  fVar75 = (local_2b8 - fVar145) * fVar106 +
           (fStack_2b4 - fVar75) * fVar126 + (fStack_2b0 - fVar104) * fVar144;
  local_278 = CONCAT44(fVar75,fVar105);
  register0x00001308 = local_258;
  local_328 = local_218;
  register0x000012c8 = local_278;
  local_b8 = local_238;
  auVar96._8_4_ = fStack_310;
  auVar96._0_8_ = local_208;
  auVar96._12_4_ = fStack_30c;
  auVar76 = minps(auVar96,_local_328);
  auVar118._8_4_ = fVar193;
  auVar118._0_8_ = local_338;
  auVar118._12_4_ = fVar194;
  auVar129 = minps(auVar118,_local_b8);
  auVar76 = minps(auVar76,auVar129);
  auVar119._4_4_ = fStack_314;
  auVar119._0_4_ = local_318;
  auVar119._8_4_ = fStack_310;
  auVar119._12_4_ = fStack_30c;
  auVar129 = maxps(auVar119,_local_328);
  auVar130._4_4_ = fVar162;
  auVar130._0_4_ = fVar146;
  auVar130._8_4_ = fVar193;
  auVar130._12_4_ = fVar194;
  auVar131 = maxps(auVar130,_local_b8);
  auVar120 = maxps(auVar129,auVar131);
  auVar24._4_8_ = auVar131._8_8_;
  auVar24._0_4_ = auVar76._4_4_;
  auVar132._0_8_ = auVar24._0_8_ << 0x20;
  auVar132._8_4_ = auVar76._8_4_;
  auVar132._12_4_ = auVar76._12_4_;
  auVar133._8_8_ = auVar76._8_8_;
  auVar133._0_8_ = auVar132._8_8_;
  auVar129 = minps(auVar76,auVar133);
  auVar25._4_8_ = auVar76._8_8_;
  auVar25._0_4_ = auVar120._4_4_;
  auVar134._0_8_ = auVar25._0_8_ << 0x20;
  auVar134._8_4_ = auVar120._8_4_;
  auVar134._12_4_ = auVar120._12_4_;
  auVar135._8_8_ = auVar120._8_8_;
  auVar135._0_8_ = auVar134._8_8_;
  auVar76 = maxps(auVar120,auVar135);
  auVar97._0_8_ = auVar129._0_8_ & 0x7fffffff7fffffff;
  auVar97._8_4_ = auVar129._8_4_ & 0x7fffffff;
  auVar97._12_4_ = auVar129._12_4_ & 0x7fffffff;
  auVar121._0_8_ = auVar76._0_8_ & 0x7fffffff7fffffff;
  auVar121._8_4_ = auVar76._8_4_ & 0x7fffffff;
  auVar121._12_4_ = auVar76._12_4_ & 0x7fffffff;
  auVar76 = maxps(auVar97,auVar121);
  fVar145 = auVar76._4_4_;
  if (auVar76._4_4_ <= auVar76._0_4_) {
    fVar145 = auVar76._0_4_;
  }
  local_2f0 = (ulong)uVar69 + 0xf;
  fVar145 = fVar145 * 9.536743e-07;
  local_148 = fVar145;
  fStack_144 = fVar145;
  fStack_140 = fVar145;
  fStack_13c = fVar145;
  local_158 = -fVar145;
  fStack_154 = -fVar145;
  fStack_150 = -fVar145;
  fStack_14c = -fVar145;
  local_88 = fVar163 - local_318;
  fStack_84 = fVar164 - fStack_314;
  fStack_80 = fVar169 - fStack_310;
  fStack_7c = fVar192 - fStack_30c;
  local_98 = fVar146 - fVar163;
  fStack_94 = fVar162 - fVar164;
  fStack_90 = fVar193 - fVar169;
  fStack_8c = fVar194 - fVar192;
  local_a8 = fVar167 - fVar146;
  fStack_a4 = fVar168 - fVar162;
  fStack_a0 = fVar105 - fVar193;
  fStack_9c = fVar75 - fVar194;
  local_188 = local_388 - local_398;
  fStack_184 = fStack_384 - fStack_394;
  fStack_180 = fStack_380 - fStack_390;
  fStack_17c = fStack_37c - fStack_38c;
  local_198 = local_3d8 - local_3a8;
  fStack_194 = fStack_3d4 - fStack_3a4;
  fStack_190 = fStack_3d0 - fStack_3a0;
  fStack_18c = fStack_3cc - fStack_39c;
  local_1a8 = local_3e8 - local_3c8;
  fStack_1a4 = fStack_3e4 - fStack_3c4;
  fStack_1a0 = fStack_3e0 - fStack_3c0;
  fStack_19c = fStack_3dc - fStack_3bc;
  local_1b8 = local_2b8 - local_3b8;
  fStack_1b4 = fStack_2b4 - fStack_3b4;
  fStack_1b0 = fStack_2b0 - fStack_3b0;
  fStack_1ac = fStack_2ac - fStack_3ac;
  local_43c = 0;
  uVar59 = 0;
  local_428 = 0x3f80000000000000;
  local_378 = 0x3f80000000000000;
  uStack_370 = 0;
  local_300 = (ulong)uVar70;
  uStack_270 = local_278;
  local_268 = uStack_330;
  uStack_260 = uStack_330;
  uStack_250 = local_258;
  uStack_240 = local_248;
  uStack_230 = local_238;
  local_228 = local_338;
  uStack_220 = local_338;
  uStack_210 = local_218;
  uStack_200 = local_208;
  do {
    fVar75 = 1.0 - (float)local_428;
    fVar104 = 1.0 - (float)local_428;
    fVar105 = 1.0 - local_428._4_4_;
    fVar106 = 1.0 - local_428._4_4_;
    fVar125 = (float)local_208 * fVar75 + (float)local_248 * (float)local_428;
    fVar167 = local_208._4_4_ * fVar104 + local_248._4_4_ * (float)local_428;
    fVar168 = (float)uStack_200 * fVar105 + (float)uStack_240 * local_428._4_4_;
    fVar169 = uStack_200._4_4_ * fVar106 + uStack_240._4_4_ * local_428._4_4_;
    fVar162 = (float)local_218 * fVar75 + (float)local_258 * (float)local_428;
    fVar205 = local_218._4_4_ * fVar104 + local_258._4_4_ * (float)local_428;
    fVar206 = (float)uStack_210 * fVar105 + (float)uStack_250 * local_428._4_4_;
    fVar215 = uStack_210._4_4_ * fVar106 + uStack_250._4_4_ * local_428._4_4_;
    fVar216 = (float)local_228 * fVar75 + (float)local_268 * (float)local_428;
    fVar237 = local_228._4_4_ * fVar104 + local_268._4_4_ * (float)local_428;
    fVar250 = (float)uStack_220 * fVar105 + (float)uStack_260 * local_428._4_4_;
    fVar253 = uStack_220._4_4_ * fVar106 + uStack_260._4_4_ * local_428._4_4_;
    fVar290 = fVar75 * (float)local_238 + (float)local_428 * (float)local_278;
    fVar292 = fVar104 * local_238._4_4_ + (float)local_428 * local_278._4_4_;
    fVar294 = fVar105 * (float)uStack_230 + local_428._4_4_ * (float)uStack_270;
    fVar296 = fVar106 * uStack_230._4_4_ + local_428._4_4_ * uStack_270._4_4_;
    fVar75 = (local_378._4_4_ - (float)local_378) * 0.11111111;
    fVar312 = (local_378._4_4_ - (float)local_378) * 0.0 + (float)local_378;
    fVar221 = (local_378._4_4_ - (float)local_378) * 0.33333334 + (float)local_378;
    fVar232 = (local_378._4_4_ - (float)local_378) * 0.6666667 + (float)local_378;
    fVar234 = (local_378._4_4_ - (float)local_378) * 1.0 + (float)local_378;
    fVar258 = 1.0 - fVar312;
    fVar269 = 1.0 - fVar221;
    fVar272 = 1.0 - fVar232;
    fVar280 = 1.0 - fVar234;
    fVar126 = fVar162 * fVar258 + fVar216 * fVar312;
    fVar127 = fVar162 * fVar269 + fVar216 * fVar221;
    fVar144 = fVar162 * fVar272 + fVar216 * fVar232;
    fVar146 = fVar162 * fVar280 + fVar216 * fVar234;
    fVar192 = fVar205 * fVar258 + fVar237 * fVar312;
    fVar193 = fVar205 * fVar269 + fVar237 * fVar221;
    fVar194 = fVar205 * fVar272 + fVar237 * fVar232;
    fVar204 = fVar205 * fVar280 + fVar237 * fVar234;
    fVar104 = (fVar125 * fVar258 + fVar162 * fVar312) * fVar258 + fVar312 * fVar126;
    fVar105 = (fVar125 * fVar269 + fVar162 * fVar221) * fVar269 + fVar221 * fVar127;
    fVar106 = (fVar125 * fVar272 + fVar162 * fVar232) * fVar272 + fVar232 * fVar144;
    fVar125 = (fVar125 * fVar280 + fVar162 * fVar234) * fVar280 + fVar234 * fVar146;
    fVar162 = (fVar167 * fVar258 + fVar205 * fVar312) * fVar258 + fVar312 * fVar192;
    fVar163 = (fVar167 * fVar269 + fVar205 * fVar221) * fVar269 + fVar221 * fVar193;
    fVar164 = (fVar167 * fVar272 + fVar205 * fVar232) * fVar272 + fVar232 * fVar194;
    fVar167 = (fVar167 * fVar280 + fVar205 * fVar234) * fVar280 + fVar234 * fVar204;
    fVar126 = fVar126 * fVar258 + (fVar216 * fVar258 + fVar290 * fVar312) * fVar312;
    fVar127 = fVar127 * fVar269 + (fVar216 * fVar269 + fVar290 * fVar221) * fVar221;
    fVar144 = fVar144 * fVar272 + (fVar216 * fVar272 + fVar290 * fVar232) * fVar232;
    fVar146 = fVar146 * fVar280 + (fVar216 * fVar280 + fVar290 * fVar234) * fVar234;
    fVar192 = fVar192 * fVar258 + (fVar237 * fVar258 + fVar292 * fVar312) * fVar312;
    fVar193 = fVar193 * fVar269 + (fVar237 * fVar269 + fVar292 * fVar221) * fVar221;
    fVar194 = fVar194 * fVar272 + (fVar237 * fVar272 + fVar292 * fVar232) * fVar232;
    fVar204 = fVar204 * fVar280 + (fVar237 * fVar280 + fVar292 * fVar234) * fVar234;
    local_2a8 = fVar258 * fVar104 + fVar312 * fVar126;
    fStack_2a4 = fVar269 * fVar105 + fVar221 * fVar127;
    fStack_2a0 = fVar272 * fVar106 + fVar232 * fVar144;
    fStack_29c = fVar280 * fVar125 + fVar234 * fVar146;
    local_298 = fVar258 * fVar162 + fVar312 * fVar192;
    fStack_294 = fVar269 * fVar163 + fVar221 * fVar193;
    fStack_290 = fVar272 * fVar164 + fVar232 * fVar194;
    fStack_28c = fVar280 * fVar167 + fVar234 * fVar204;
    fVar127 = (fVar127 - fVar105) * 3.0 * fVar75;
    fVar106 = (fVar144 - fVar106) * 3.0 * fVar75;
    fVar125 = (fVar146 - fVar125) * 3.0 * fVar75;
    fVar144 = (fVar193 - fVar163) * 3.0 * fVar75;
    fVar146 = (fVar194 - fVar164) * 3.0 * fVar75;
    fVar163 = (fVar204 - fVar167) * 3.0 * fVar75;
    local_e8._4_4_ = fStack_2a0;
    local_e8._0_4_ = fStack_2a4;
    local_c8._4_4_ = fStack_290;
    local_c8._0_4_ = fStack_294;
    local_348._0_4_ = local_2a8 + (fVar126 - fVar104) * 3.0 * fVar75;
    local_348._4_4_ = fStack_2a4 + fVar127;
    fStack_340 = fStack_2a0 + fVar106;
    fStack_33c = fStack_29c + fVar125;
    fVar104 = local_298 + (fVar192 - fVar162) * 3.0 * fVar75;
    fVar105 = fStack_294 + fVar144;
    fStack_430 = fStack_290 + fVar146;
    fStack_42c = fStack_28c + fVar163;
    local_288._0_4_ = fStack_2a4 - fVar127;
    local_288._4_4_ = fStack_2a0 - fVar106;
    local_288._8_4_ = fStack_29c - fVar125;
    local_288._12_4_ = 0;
    local_c8._8_4_ = fStack_28c;
    local_c8._12_4_ = 0;
    local_d8._0_4_ = fStack_294 - fVar144;
    local_d8._4_4_ = fStack_290 - fVar146;
    local_d8._8_4_ = fStack_28c - fVar163;
    local_d8._12_4_ = 0;
    fVar106 = fVar206 * fVar258 + fVar250 * fVar312;
    fVar125 = fVar206 * fVar269 + fVar250 * fVar221;
    fVar126 = fVar206 * fVar272 + fVar250 * fVar232;
    fVar127 = fVar206 * fVar280 + fVar250 * fVar234;
    fVar144 = fVar215 * fVar258 + fVar253 * fVar312;
    fVar146 = fVar215 * fVar269 + fVar253 * fVar221;
    fVar162 = fVar215 * fVar272 + fVar253 * fVar232;
    fVar163 = fVar215 * fVar280 + fVar253 * fVar234;
    fVar192 = (fVar168 * fVar258 + fVar206 * fVar312) * fVar258 + fVar312 * fVar106;
    fVar193 = (fVar168 * fVar269 + fVar206 * fVar221) * fVar269 + fVar221 * fVar125;
    fVar194 = (fVar168 * fVar272 + fVar206 * fVar232) * fVar272 + fVar232 * fVar126;
    fVar204 = (fVar168 * fVar280 + fVar206 * fVar234) * fVar280 + fVar234 * fVar127;
    fVar164 = (fVar169 * fVar258 + fVar215 * fVar312) * fVar258 + fVar312 * fVar144;
    fVar167 = (fVar169 * fVar269 + fVar215 * fVar221) * fVar269 + fVar221 * fVar146;
    fVar168 = (fVar169 * fVar272 + fVar215 * fVar232) * fVar272 + fVar232 * fVar162;
    fVar169 = (fVar169 * fVar280 + fVar215 * fVar234) * fVar280 + fVar234 * fVar163;
    fVar106 = fVar106 * fVar258 + (fVar250 * fVar258 + fVar294 * fVar312) * fVar312;
    fVar125 = fVar125 * fVar269 + (fVar250 * fVar269 + fVar294 * fVar221) * fVar221;
    fVar126 = fVar126 * fVar272 + (fVar250 * fVar272 + fVar294 * fVar232) * fVar232;
    fVar127 = fVar127 * fVar280 + (fVar250 * fVar280 + fVar294 * fVar234) * fVar234;
    fVar205 = fVar144 * fVar258 + (fVar253 * fVar258 + fVar296 * fVar312) * fVar312;
    fVar206 = fVar146 * fVar269 + (fVar253 * fVar269 + fVar296 * fVar221) * fVar221;
    fVar215 = fVar162 * fVar272 + (fVar253 * fVar272 + fVar296 * fVar232) * fVar232;
    fVar216 = fVar163 * fVar280 + (fVar253 * fVar280 + fVar296 * fVar234) * fVar234;
    fVar144 = fVar258 * fVar192 + fVar312 * fVar106;
    fVar146 = fVar269 * fVar193 + fVar221 * fVar125;
    fVar162 = fVar272 * fVar194 + fVar232 * fVar126;
    fVar163 = fVar280 * fVar204 + fVar234 * fVar127;
    fVar237 = fVar258 * fVar164 + fVar312 * fVar205;
    fVar250 = fVar269 * fVar167 + fVar221 * fVar206;
    fVar253 = fVar272 * fVar168 + fVar232 * fVar215;
    fVar312 = fVar280 * fVar169 + fVar234 * fVar216;
    fVar125 = (fVar125 - fVar193) * 3.0 * fVar75;
    fVar126 = (fVar126 - fVar194) * 3.0 * fVar75;
    fVar127 = (fVar127 - fVar204) * 3.0 * fVar75;
    fVar167 = (fVar206 - fVar167) * 3.0 * fVar75;
    fVar168 = (fVar215 - fVar168) * 3.0 * fVar75;
    fVar169 = (fVar216 - fVar169) * 3.0 * fVar75;
    local_f8._4_4_ = fVar162;
    local_f8._0_4_ = fVar146;
    local_f8._8_4_ = fVar163;
    local_f8._12_4_ = 0;
    local_118._4_4_ = fVar253;
    local_118._0_4_ = fVar250;
    local_118._8_4_ = fVar312;
    local_118._12_4_ = 0;
    local_358 = fVar144 + (fVar106 - fVar192) * 3.0 * fVar75;
    fStack_354 = fVar146 + fVar125;
    fStack_350 = fVar162 + fVar126;
    fStack_34c = fVar163 + fVar127;
    local_108 = fVar237 + (fVar205 - fVar164) * 3.0 * fVar75;
    fStack_104 = fVar250 + fVar167;
    fStack_100 = fVar253 + fVar168;
    fStack_fc = fVar312 + fVar169;
    local_138._0_4_ = fVar146 - fVar125;
    local_138._4_4_ = fVar162 - fVar126;
    local_138._8_4_ = fVar163 - fVar127;
    local_138._12_4_ = 0;
    local_128._0_4_ = fVar250 - fVar167;
    local_128._4_4_ = fVar253 - fVar168;
    local_128._8_4_ = fVar312 - fVar169;
    local_128._12_4_ = 0;
    local_e8._8_4_ = fStack_29c;
    local_e8._12_4_ = 0;
    fVar127 = (fVar146 - fStack_2a4) + (fVar144 - local_2a8);
    fVar164 = (fVar162 - fStack_2a0) + (fVar146 - fStack_2a4);
    fVar167 = (fVar163 - fStack_29c) + (fVar162 - fStack_2a0);
    fVar168 = (fVar163 - fStack_29c) + 0.0;
    fVar75 = (fVar250 - fStack_294) + (fVar237 - local_298);
    fVar106 = (fVar253 - fStack_290) + (fVar250 - fStack_294);
    fVar125 = (fVar312 - fStack_28c) + (fVar253 - fStack_290);
    fVar126 = (fVar312 - fStack_28c) + 0.0;
    auVar186._0_8_ =
         CONCAT44(fStack_294 * fVar164 - fStack_2a4 * fVar106,
                  local_298 * fVar127 - local_2a8 * fVar75);
    auVar186._8_4_ = fStack_290 * fVar167 - fStack_2a0 * fVar125;
    auVar186._12_4_ = fStack_28c * fVar168 - fStack_29c * fVar126;
    auVar136._0_4_ = fVar104 * fVar127 - (float)local_348._0_4_ * fVar75;
    auVar136._4_4_ = fVar105 * fVar164 - (float)local_348._4_4_ * fVar106;
    auVar136._8_4_ = fStack_430 * fVar167 - fStack_340 * fVar125;
    auVar136._12_4_ = fStack_42c * fVar168 - fStack_33c * fVar126;
    auVar152._0_8_ =
         CONCAT44(local_d8._4_4_ * fVar164 - fVar106 * local_288._4_4_,
                  local_d8._0_4_ * fVar127 - fVar75 * local_288._0_4_);
    auVar152._8_4_ = local_d8._8_4_ * fVar167 - fVar125 * local_288._8_4_;
    auVar152._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
    auVar328._0_4_ = fVar127 * fStack_294 - fVar75 * fStack_2a4;
    auVar328._4_4_ = fVar164 * fStack_290 - fVar106 * fStack_2a0;
    auVar328._8_4_ = fVar167 * fStack_28c - fVar125 * fStack_29c;
    auVar328._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
    auVar98._0_8_ =
         CONCAT44(fVar250 * fVar164 - fVar146 * fVar106,fVar237 * fVar127 - fVar144 * fVar75);
    auVar98._8_4_ = fVar253 * fVar167 - fVar162 * fVar125;
    auVar98._12_4_ = fVar312 * fVar168 - fVar163 * fVar126;
    auVar287._0_4_ = local_108 * fVar127 - local_358 * fVar75;
    auVar287._4_4_ = fStack_104 * fVar164 - fStack_354 * fVar106;
    auVar287._8_4_ = fStack_100 * fVar167 - fStack_350 * fVar125;
    auVar287._12_4_ = fStack_fc * fVar168 - fStack_34c * fVar126;
    auVar223._0_8_ =
         CONCAT44(local_128._4_4_ * fVar164 - fVar106 * local_138._4_4_,
                  local_128._0_4_ * fVar127 - fVar75 * local_138._0_4_);
    auVar223._8_4_ = local_128._8_4_ * fVar167 - fVar125 * local_138._8_4_;
    auVar223._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
    auVar265._0_4_ = fVar127 * fVar250 - fVar75 * fVar146;
    auVar265._4_4_ = fVar164 * fVar253 - fVar106 * fVar162;
    auVar265._8_4_ = fVar167 * fVar312 - fVar125 * fVar163;
    auVar265._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
    auVar320._8_4_ = auVar186._8_4_;
    auVar320._0_8_ = auVar186._0_8_;
    auVar320._12_4_ = auVar186._12_4_;
    auVar120 = minps(auVar320,auVar136);
    auVar129 = maxps(auVar186,auVar136);
    auVar137._8_4_ = auVar152._8_4_;
    auVar137._0_8_ = auVar152._0_8_;
    auVar137._12_4_ = auVar152._12_4_;
    auVar76 = minps(auVar137,auVar328);
    auVar321 = minps(auVar120,auVar76);
    auVar76 = maxps(auVar152,auVar328);
    auVar131 = maxps(auVar129,auVar76);
    auVar138._8_4_ = auVar98._8_4_;
    auVar138._0_8_ = auVar98._0_8_;
    auVar138._12_4_ = auVar98._12_4_;
    auVar129 = minps(auVar138,auVar287);
    auVar76 = maxps(auVar98,auVar287);
    auVar153._8_4_ = auVar223._8_4_;
    auVar153._0_8_ = auVar223._0_8_;
    auVar153._12_4_ = auVar223._12_4_;
    auVar120 = minps(auVar153,auVar265);
    auVar129 = minps(auVar129,auVar120);
    auVar120 = minps(auVar321,auVar129);
    auVar129 = maxps(auVar223,auVar265);
    auVar76 = maxps(auVar76,auVar129);
    auVar76 = maxps(auVar131,auVar76);
    bVar68 = auVar120._4_4_ <= fStack_144;
    bVar22 = auVar120._8_4_ <= fStack_140;
    bVar23 = auVar120._12_4_ <= fStack_13c;
    auVar56._4_4_ = -(uint)bVar22;
    auVar56._0_4_ = -(uint)bVar68;
    auVar56._8_4_ = -(uint)bVar23;
    auVar56._12_4_ = 0;
    auVar322 = auVar56 << 0x20;
    auVar187._0_4_ =
         -(uint)(local_158 <= auVar76._0_4_ && auVar120._0_4_ <= local_148) & local_168._0_4_;
    auVar187._4_4_ = -(uint)(fStack_154 <= auVar76._4_4_ && bVar68) & local_168._4_4_;
    auVar187._8_4_ = -(uint)(fStack_150 <= auVar76._8_4_ && bVar22) & local_168._8_4_;
    auVar187._12_4_ = -(uint)(fStack_14c <= auVar76._12_4_ && bVar23) & local_168._12_4_;
    iVar63 = movmskps((int)uVar64,auVar187);
    uVar60 = 0;
    if (iVar63 != 0) {
      fVar127 = (fVar146 - fVar144) + (fStack_2a4 - local_2a8);
      fVar164 = (fVar162 - fVar146) + (fStack_2a0 - fStack_2a4);
      fVar167 = (fVar163 - fVar162) + (fStack_29c - fStack_2a0);
      fVar168 = (0.0 - fVar163) + (0.0 - fStack_29c);
      fVar75 = (fVar250 - fVar237) + (fStack_294 - local_298);
      fVar106 = (fVar253 - fVar250) + (fStack_290 - fStack_294);
      fVar125 = (fVar312 - fVar253) + (fStack_28c - fStack_290);
      fVar126 = (0.0 - fVar312) + (0.0 - fStack_28c);
      auVar329._0_8_ =
           CONCAT44(fStack_294 * fVar164 - fStack_2a4 * fVar106,
                    local_298 * fVar127 - local_2a8 * fVar75);
      auVar329._8_4_ = fStack_290 * fVar167 - fStack_2a0 * fVar125;
      auVar329._12_4_ = fStack_28c * fVar168 - fStack_29c * fVar126;
      auVar139._0_4_ = fVar104 * fVar127 - (float)local_348._0_4_ * fVar75;
      auVar139._4_4_ = fVar105 * fVar164 - (float)local_348._4_4_ * fVar106;
      auVar139._8_4_ = fStack_430 * fVar167 - fStack_340 * fVar125;
      auVar139._12_4_ = fStack_42c * fVar168 - fStack_33c * fVar126;
      auVar322._0_4_ = local_288._0_4_ * fVar75;
      auVar322._4_4_ = local_288._4_4_ * fVar106;
      auVar322._8_4_ = local_288._8_4_ * fVar125;
      auVar322._12_4_ = fVar126 * 0.0;
      auVar212._0_8_ =
           CONCAT44(local_d8._4_4_ * fVar164 - auVar322._4_4_,
                    local_d8._0_4_ * fVar127 - auVar322._0_4_);
      auVar212._8_4_ = local_d8._8_4_ * fVar167 - auVar322._8_4_;
      auVar212._12_4_ = fVar168 * 0.0 - auVar322._12_4_;
      auVar154._0_4_ = fStack_294 * fVar127 - fStack_2a4 * fVar75;
      auVar154._4_4_ = fStack_290 * fVar164 - fStack_2a0 * fVar106;
      auVar154._8_4_ = fStack_28c * fVar167 - fStack_29c * fVar125;
      auVar154._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
      auVar314._0_8_ =
           CONCAT44(fVar250 * fVar164 - fVar146 * fVar106,fVar237 * fVar127 - fVar144 * fVar75);
      auVar314._8_4_ = fVar253 * fVar167 - fVar162 * fVar125;
      auVar314._12_4_ = fVar312 * fVar168 - fVar163 * fVar126;
      auVar165._0_4_ = local_108 * fVar127 - local_358 * fVar75;
      auVar165._4_4_ = fStack_104 * fVar164 - fStack_354 * fVar106;
      auVar165._8_4_ = fStack_100 * fVar167 - fStack_350 * fVar125;
      auVar165._12_4_ = fStack_fc * fVar168 - fStack_34c * fVar126;
      auVar288._0_8_ =
           CONCAT44(local_128._4_4_ * fVar164 - local_138._4_4_ * fVar106,
                    local_128._0_4_ * fVar127 - local_138._0_4_ * fVar75);
      auVar288._8_4_ = local_128._8_4_ * fVar167 - local_138._8_4_ * fVar125;
      auVar288._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
      auVar266._0_4_ = fVar127 * fVar250 - fVar75 * fVar146;
      auVar266._4_4_ = fVar164 * fVar253 - fVar106 * fVar162;
      auVar266._8_4_ = fVar167 * fVar312 - fVar125 * fVar163;
      auVar266._12_4_ = fVar168 * 0.0 - fVar126 * 0.0;
      auVar99._8_4_ = auVar329._8_4_;
      auVar99._0_8_ = auVar329._0_8_;
      auVar99._12_4_ = auVar329._12_4_;
      auVar76 = minps(auVar99,auVar139);
      auVar120 = maxps(auVar329,auVar139);
      auVar140._8_4_ = auVar212._8_4_;
      auVar140._0_8_ = auVar212._0_8_;
      auVar140._12_4_ = auVar212._12_4_;
      auVar129 = minps(auVar140,auVar154);
      auVar76 = minps(auVar76,auVar129);
      auVar129 = maxps(auVar212,auVar154);
      auVar321 = maxps(auVar120,auVar129);
      auVar141._8_4_ = auVar314._8_4_;
      auVar141._0_8_ = auVar314._0_8_;
      auVar141._12_4_ = auVar314._12_4_;
      auVar129 = minps(auVar141,auVar165);
      auVar131 = maxps(auVar314,auVar165);
      auVar155._8_4_ = auVar288._8_4_;
      auVar155._0_8_ = auVar288._0_8_;
      auVar155._12_4_ = auVar288._12_4_;
      auVar120 = minps(auVar155,auVar266);
      auVar129 = minps(auVar129,auVar120);
      auVar76 = minps(auVar76,auVar129);
      auVar129 = maxps(auVar288,auVar266);
      auVar129 = maxps(auVar131,auVar129);
      auVar129 = maxps(auVar321,auVar129);
      auVar330._0_4_ =
           -(uint)(local_158 <= auVar129._0_4_ && auVar76._0_4_ <= local_148) & auVar187._0_4_;
      auVar330._4_4_ =
           -(uint)(fStack_154 <= auVar129._4_4_ && auVar76._4_4_ <= fStack_144) & auVar187._4_4_;
      auVar330._8_4_ =
           -(uint)(fStack_150 <= auVar129._8_4_ && auVar76._8_4_ <= fStack_140) & auVar187._8_4_;
      auVar330._12_4_ =
           -(uint)(fStack_14c <= auVar129._12_4_ && auVar76._12_4_ <= fStack_13c) & auVar187._12_4_;
      uVar70 = movmskps(0,auVar330);
      uVar60 = (ulong)uVar70;
    }
    if ((uint)uVar60 != 0) {
      auStack_1f8[uVar59] = (uint)uVar60;
      *(undefined8 *)(afStack_78 + uVar59 * 2) = local_378;
      auStack_58[uVar59] = local_428;
      uVar59 = (ulong)((int)uVar59 + 1);
    }
    do {
      if ((int)uVar59 == 0) {
        if (local_43c != 0) {
          return local_43d;
        }
        fVar145 = ray->tfar;
        auVar124._4_4_ = -(uint)(fStack_174 <= fVar145);
        auVar124._0_4_ = -(uint)(local_178 <= fVar145);
        auVar124._8_4_ = -(uint)(fStack_170 <= fVar145);
        auVar124._12_4_ = -(uint)(fStack_16c <= fVar145);
        uVar70 = movmskps((int)uVar60,auVar124);
        uVar69 = uVar69 & (uint)local_2f0 & uVar70;
        local_43d = uVar69 != 0;
        if (!local_43d) {
          return local_43d;
        }
        goto LAB_00bd051d;
      }
      uVar72 = (int)uVar59 - 1;
      uVar61 = (ulong)uVar72;
      uVar70 = auStack_1f8[uVar61];
      local_428 = auStack_58[uVar61];
      uVar60 = 0;
      if (uVar70 != 0) {
        for (; (uVar70 >> uVar60 & 1) == 0; uVar60 = uVar60 + 1) {
        }
      }
      uVar70 = uVar70 - 1 & uVar70;
      auStack_1f8[uVar61] = uVar70;
      if (uVar70 == 0) {
        uVar59 = (ulong)uVar72;
      }
      uVar65 = uVar60 + 1;
      uVar64 = uVar65;
      if ((long)uVar65 < 0) {
        uVar64 = (ulong)((uint)uVar65 & 1) | uVar65 >> 1;
      }
      fVar75 = afStack_78[uVar61 * 2];
      fVar104 = *(float *)((long)auStack_58 + uVar61 * 8 + -0x1c);
      fVar105 = fVar75 * (1.0 - (float)uVar60 * 0.33333334) + fVar104 * (float)uVar60 * 0.33333334;
      fVar106 = fVar75 * (1.0 - (float)uVar65 * 0.33333334) + fVar104 * (float)uVar65 * 0.33333334;
      fVar125 = fVar75 * 0.0 + fVar104 * 0.0;
      fVar104 = fVar75 * 0.0 + fVar104 * 0.0;
      fVar75 = fVar106 - fVar105;
      local_378 = CONCAT44(fVar106,fVar105);
      uStack_370 = CONCAT44(fVar104,fVar125);
      if (0.16666667 <= fVar75) break;
      fVar126 = (float)local_428;
      fVar127 = (float)((ulong)local_428 >> 0x20);
      fVar144 = 1.0 - fVar126;
      fVar146 = 1.0 - fVar126;
      fVar192 = 1.0 - fVar127;
      fVar193 = 1.0 - fVar127;
      fVar162 = (float)local_208 * fVar144 + (float)local_248 * fVar126;
      fVar163 = local_208._4_4_ * fVar146 + local_248._4_4_ * fVar126;
      fVar164 = (float)uStack_200 * fVar192 + (float)uStack_240 * fVar127;
      fVar167 = uStack_200._4_4_ * fVar193 + uStack_240._4_4_ * fVar127;
      fVar194 = (float)local_218 * fVar144 + (float)local_258 * fVar126;
      fVar204 = local_218._4_4_ * fVar146 + local_258._4_4_ * fVar126;
      fVar205 = (float)uStack_210 * fVar192 + (float)uStack_250 * fVar127;
      fVar206 = uStack_210._4_4_ * fVar193 + uStack_250._4_4_ * fVar127;
      fVar215 = (float)local_228 * fVar144 + (float)local_268 * fVar126;
      fVar237 = local_228._4_4_ * fVar146 + local_268._4_4_ * fVar126;
      fVar253 = (float)uStack_220 * fVar192 + (float)uStack_260 * fVar127;
      fVar221 = uStack_220._4_4_ * fVar193 + uStack_260._4_4_ * fVar127;
      fVar168 = (fVar144 * (float)local_238 + fVar126 * (float)local_278) - fVar215;
      fVar169 = (fVar146 * local_238._4_4_ + fVar126 * local_278._4_4_) - fVar237;
      fVar192 = (fVar192 * (float)uStack_230 + fVar127 * (float)uStack_270) - fVar253;
      fVar193 = (fVar193 * uStack_230._4_4_ + fVar127 * uStack_270._4_4_) - fVar221;
      fVar126 = fVar105 * (fVar215 - fVar194) + fVar194;
      fVar127 = fVar105 * (fVar237 - fVar204) + fVar204;
      fVar144 = fVar105 * (fVar253 - fVar205) + fVar205;
      fVar146 = fVar105 * (fVar221 - fVar206) + fVar206;
      fVar216 = (fVar215 - fVar194) * fVar106 + fVar194;
      fVar250 = (fVar237 - fVar204) * fVar106 + fVar204;
      fVar312 = (fVar253 - fVar205) * fVar106 + fVar205;
      fVar232 = (fVar221 - fVar206) * fVar106 + fVar206;
      fVar234 = fVar105 * (fVar194 - fVar162) + fVar162;
      fVar258 = fVar105 * (fVar204 - fVar163) + fVar163;
      fVar269 = fVar105 * (fVar205 - fVar164) + fVar164;
      fVar272 = fVar105 * (fVar206 - fVar167) + fVar167;
      fVar234 = (fVar126 - fVar234) * fVar105 + fVar234;
      fVar258 = (fVar127 - fVar258) * fVar105 + fVar258;
      fVar269 = (fVar144 - fVar269) * fVar105 + fVar269;
      fVar272 = (fVar146 - fVar272) * fVar105 + fVar272;
      fVar126 = (((fVar105 * fVar168 + fVar215) - fVar126) * fVar105 + fVar126) - fVar234;
      fVar127 = (((fVar105 * fVar169 + fVar237) - fVar127) * fVar105 + fVar127) - fVar258;
      fVar144 = (((fVar105 * fVar192 + fVar253) - fVar144) * fVar105 + fVar144) - fVar269;
      fVar146 = (((fVar105 * fVar193 + fVar221) - fVar146) * fVar105 + fVar146) - fVar272;
      auVar100._0_4_ = fVar105 * fVar126 + fVar234;
      auVar100._4_4_ = fVar105 * fVar127 + fVar258;
      auVar100._8_4_ = fVar105 * fVar144 + fVar269;
      auVar100._12_4_ = fVar105 * fVar146 + fVar272;
      fVar162 = (fVar194 - fVar162) * fVar106 + fVar162;
      fVar163 = (fVar204 - fVar163) * fVar106 + fVar163;
      fVar164 = (fVar205 - fVar164) * fVar106 + fVar164;
      fVar167 = (fVar206 - fVar167) * fVar106 + fVar167;
      fVar162 = (fVar216 - fVar162) * fVar106 + fVar162;
      fVar163 = (fVar250 - fVar163) * fVar106 + fVar163;
      fVar164 = (fVar312 - fVar164) * fVar106 + fVar164;
      fVar167 = (fVar232 - fVar167) * fVar106 + fVar167;
      fVar194 = (((fVar168 * fVar106 + fVar215) - fVar216) * fVar106 + fVar216) - fVar162;
      fVar204 = (((fVar169 * fVar106 + fVar237) - fVar250) * fVar106 + fVar250) - fVar163;
      fVar205 = (((fVar192 * fVar106 + fVar253) - fVar312) * fVar106 + fVar312) - fVar164;
      fVar206 = (((fVar193 * fVar106 + fVar221) - fVar232) * fVar106 + fVar232) - fVar167;
      fVar162 = fVar106 * fVar194 + fVar162;
      fVar163 = fVar106 * fVar204 + fVar163;
      fVar164 = fVar106 * fVar205 + fVar164;
      fVar167 = fVar106 * fVar206 + fVar167;
      fVar215 = fVar75 * 0.33333334;
      fVar168 = fVar126 * 3.0 * fVar215 + auVar100._0_4_;
      fVar169 = fVar127 * 3.0 * fVar215 + auVar100._4_4_;
      fVar192 = fVar144 * 3.0 * fVar215 + auVar100._8_4_;
      fVar193 = fVar146 * 3.0 * fVar215 + auVar100._12_4_;
      fVar194 = fVar162 - fVar215 * fVar194 * 3.0;
      fVar204 = fVar163 - fVar215 * fVar204 * 3.0;
      fVar205 = fVar164 - fVar215 * fVar205 * 3.0;
      fVar206 = fVar167 - fVar215 * fVar206 * 3.0;
      auVar26._4_8_ = auVar322._8_8_;
      auVar26._0_4_ = auVar100._4_4_;
      auVar323._0_8_ = auVar26._0_8_ << 0x20;
      auVar323._8_4_ = auVar100._8_4_;
      auVar323._12_4_ = auVar100._12_4_;
      auVar324._8_8_ = auVar100._8_8_;
      auVar324._0_8_ = auVar323._8_8_;
      fVar250 = (fVar164 - fVar162) + (auVar100._8_4_ - auVar100._0_4_);
      fVar253 = (fVar167 - fVar163) + (auVar100._12_4_ - auVar100._4_4_);
      auVar224._0_4_ = fVar253 * fVar163;
      auVar224._4_4_ = fVar253 * fVar163;
      auVar224._8_4_ = fVar253 * fVar167;
      auVar224._12_4_ = fVar253 * fVar167;
      fVar126 = auVar100._0_4_ * fVar250 + auVar100._4_4_ * fVar253;
      fVar127 = auVar100._8_4_ * fVar250 + auVar100._12_4_ * fVar253;
      fVar312 = fVar168 * fVar250 + fVar169 * fVar253;
      fVar221 = fVar192 * fVar250 + fVar193 * fVar253;
      fVar215 = fVar194 * fVar250 + fVar204 * fVar253;
      auVar244._4_4_ = fVar204 * fVar250 + fVar204 * fVar253;
      auVar244._0_4_ = fVar215;
      fVar216 = fVar205 * fVar250 + fVar206 * fVar253;
      fVar144 = fVar250 * fVar162 + auVar224._0_4_;
      fVar237 = fVar250 * fVar164 + auVar224._8_4_;
      auVar27._4_8_ = auVar224._8_8_;
      auVar27._0_4_ = fVar169 * fVar250 + fVar169 * fVar253;
      auVar225._0_8_ = auVar27._0_8_ << 0x20;
      auVar225._8_4_ = fVar221;
      auVar225._12_4_ = fVar193 * fVar250 + fVar193 * fVar253;
      fVar146 = fVar312;
      if (fVar312 <= fVar126) {
        fVar146 = fVar126;
        fVar126 = fVar312;
      }
      auVar226._8_8_ = auVar225._8_8_;
      auVar226._0_8_ = auVar226._8_8_;
      auVar244._8_4_ = fVar216;
      auVar244._12_4_ = fVar206 * fVar250 + fVar206 * fVar253;
      if (fVar144 <= fVar215) {
        auVar244._0_4_ = fVar144;
      }
      if (auVar244._0_4_ <= fVar126) {
        fVar126 = auVar244._0_4_;
      }
      auVar28._4_8_ = auVar244._8_8_;
      auVar28._0_4_ = fVar250 * fVar163 + auVar224._4_4_;
      auVar245._0_8_ = auVar28._0_8_ << 0x20;
      auVar245._8_4_ = fVar237;
      auVar245._12_4_ = fVar250 * fVar167 + auVar224._12_4_;
      if (fVar144 <= fVar215) {
        fVar144 = fVar215;
      }
      auVar246._8_8_ = auVar245._8_8_;
      auVar246._0_8_ = auVar246._8_8_;
      if (fVar144 <= fVar146) {
        fVar144 = fVar146;
      }
      if (fVar221 <= fVar127) {
        auVar226._0_4_ = fVar127;
        fVar127 = fVar221;
      }
      fVar146 = fVar216;
      if (fVar237 <= fVar216) {
        fVar146 = fVar237;
      }
      if (fVar146 <= fVar127) {
        fVar127 = fVar146;
      }
      if (fVar237 <= fVar216) {
        auVar246._0_4_ = fVar216;
      }
      if (auVar246._0_4_ <= auVar226._0_4_) {
        auVar246._0_4_ = auVar226._0_4_;
      }
      uVar64 = CONCAT71((int7)(uVar64 >> 8),fVar75 < 0.001);
      bVar68 = 3 < (uint)uVar59;
      uVar29 = (undefined3)(uVar72 >> 8);
      uVar60 = (ulong)CONCAT31(uVar29,bVar68);
      fVar146 = auVar246._0_4_;
      if ((0.0001 <= fVar126) || (fVar146 <= -0.0001)) {
        if ((-0.0001 < fVar144 && fVar127 < 0.0001) ||
           ((fVar126 < 0.0001 && -0.0001 < fVar144 || (fVar127 < 0.0001 && -0.0001 < fVar146))))
        goto LAB_00bd1c1e;
        bVar22 = true;
        auVar322 = auVar324;
      }
      else {
LAB_00bd1c1e:
        local_428 = CONCAT44(fVar167,fVar164);
        bVar68 = bVar68 || fVar75 < 0.001;
        uVar60 = (ulong)CONCAT31(uVar29,bVar68);
        fVar237 = (float)(~-(uint)(fVar126 < 0.0) & 0x3f800000 | -(uint)(fVar126 < 0.0) & 0xbf800000
                         );
        fVar216 = (float)(~-(uint)(fVar144 < 0.0) & 0x3f800000 | -(uint)(fVar144 < 0.0) & 0xbf800000
                         );
        fVar215 = 0.0;
        if ((fVar237 == fVar216) && (!NAN(fVar237) && !NAN(fVar216))) {
          fVar215 = INFINITY;
        }
        fVar250 = 0.0;
        if ((fVar237 == fVar216) && (!NAN(fVar237) && !NAN(fVar216))) {
          fVar250 = -INFINITY;
        }
        fVar253 = (float)(~-(uint)(fVar127 < 0.0) & 0x3f800000 | -(uint)(fVar127 < 0.0) & 0xbf800000
                         );
        if ((fVar237 != fVar253) || (fVar312 = fVar250, NAN(fVar237) || NAN(fVar253))) {
          if ((fVar127 != fVar126) || (NAN(fVar127) || NAN(fVar126))) {
            fVar127 = -fVar126 / (fVar127 - fVar126);
            fVar127 = (1.0 - fVar127) * 0.0 + fVar127;
            fVar312 = fVar127;
          }
          else {
            fVar127 = INFINITY;
            if ((fVar126 == 0.0) && (fVar127 = INFINITY, !NAN(fVar126))) {
              fVar127 = 0.0;
            }
            fVar312 = *(float *)(&DAT_01ff1ec4 + (ulong)(-(uint)(fVar126 == 0.0) & 1) * 4);
          }
          if (fVar127 <= fVar215) {
            fVar215 = fVar127;
          }
          if (fVar312 <= fVar250) {
            fVar312 = fVar250;
          }
        }
        uVar64 = (ulong)(fVar146 < 0.0);
        fVar126 = *(float *)(&DAT_01ff1ecc + uVar64 * 4);
        if ((fVar216 != fVar126) || (fVar127 = fVar312, NAN(fVar216) || NAN(fVar126))) {
          if ((fVar146 != fVar144) || (NAN(fVar146) || NAN(fVar144))) {
            fVar146 = -fVar144 / (fVar146 - fVar144);
            fVar146 = (1.0 - fVar146) * 0.0 + fVar146;
            fVar127 = fVar146;
          }
          else {
            fVar146 = INFINITY;
            if ((fVar144 == 0.0) && (fVar146 = INFINITY, !NAN(fVar144))) {
              fVar146 = 0.0;
            }
            uVar64 = (ulong)(-(uint)(fVar144 == 0.0) & 1);
            fVar127 = *(float *)(&DAT_01ff1ec4 + uVar64 * 4);
          }
          if (fVar146 <= fVar215) {
            fVar215 = fVar146;
          }
          if (fVar127 <= fVar312) {
            fVar127 = fVar312;
          }
        }
        if ((fVar253 != fVar126) || (NAN(fVar253) || NAN(fVar126))) {
          fVar215 = (float)(~-(uint)(fVar215 < 1.0) & 0x3f800000 |
                           (uint)fVar215 & -(uint)(fVar215 < 1.0));
          fVar127 = (float)(~-(uint)(fVar127 < 1.0) & (uint)fVar127 |
                           -(uint)(fVar127 < 1.0) & 0x3f800000);
        }
        fVar144 = SUB164(ZEXT816(0x3f80000000000000),4);
        uVar70 = -(uint)(fVar127 < fVar144);
        fVar215 = (float)(~-(uint)(fVar215 < 0.0) & (uint)fVar215);
        fVar126 = (float)(~uVar70 & 0x3f800000 | (uint)fVar127 & uVar70);
        bVar22 = true;
        auVar322 = ZEXT816(0x3f80000000000000);
        _local_348 = auVar324;
        if (fVar215 <= fVar126) {
          fVar215 = fVar215 + -0.1;
          fVar126 = fVar126 + 0.1;
          uVar70 = -(uint)(fVar126 < fVar144);
          fVar215 = (float)(~-(uint)(fVar215 < 0.0) & (uint)fVar215);
          fVar232 = (float)(~uVar70 & 0x3f800000 | (uint)fVar126 & uVar70);
          fVar250 = 1.0 - fVar215;
          fVar253 = 1.0 - fVar215;
          fVar312 = 1.0 - fVar232;
          fVar221 = 1.0 - fVar232;
          fVar126 = auVar100._0_4_ * fVar250 + auVar100._8_4_ * fVar215;
          fVar127 = auVar100._4_4_ * fVar253 + auVar100._12_4_ * fVar215;
          fVar144 = auVar100._0_4_ * fVar312 + auVar100._8_4_ * fVar232;
          fVar146 = auVar100._4_4_ * fVar221 + auVar100._12_4_ * fVar232;
          fVar216 = fVar168 * fVar250 + fVar192 * fVar215;
          fVar237 = fVar169 * fVar253 + fVar193 * fVar215;
          fVar168 = fVar168 * fVar312 + fVar192 * fVar232;
          fVar169 = fVar169 * fVar221 + fVar193 * fVar232;
          fVar192 = fVar194 * fVar250 + fVar205 * fVar215;
          fVar193 = fVar204 * fVar253 + fVar206 * fVar215;
          fVar194 = fVar194 * fVar312 + fVar205 * fVar232;
          fVar204 = fVar204 * fVar221 + fVar206 * fVar232;
          fVar205 = fVar250 * fVar162 + fVar164 * fVar215;
          fVar206 = fVar253 * fVar163 + fVar167 * fVar215;
          fVar162 = fVar312 * fVar162 + fStack_430 * fVar232;
          fVar163 = fVar221 * fVar163 + fStack_42c * fVar232;
          fVar306 = fVar164 * (1.0 - fVar215) + fVar167 * fVar215;
          fStack_42c = fVar164 * (1.0 - fVar232) + fVar167 * fVar232;
          fVar75 = 1.0 / fVar75;
          auVar122._0_4_ = fVar162 - fVar205;
          auVar122._4_4_ = fVar163 - fVar206;
          auVar122._8_4_ = fVar162 - fVar162;
          auVar122._12_4_ = fVar163 - fVar163;
          auVar156._0_8_ = CONCAT44(fVar204 - fVar193,fVar194 - fVar192);
          auVar156._8_4_ = fVar194 - fVar194;
          auVar156._12_4_ = fVar204 - fVar204;
          auVar267._0_4_ = fVar168 - fVar216;
          auVar267._4_4_ = fVar169 - fVar237;
          auVar267._8_4_ = fVar168 - fVar168;
          auVar267._12_4_ = fVar169 - fVar169;
          auVar213._0_8_ = CONCAT44((fVar237 - fVar127) * 3.0,(fVar216 - fVar126) * 3.0);
          auVar213._8_4_ = (fVar168 - fVar144) * 3.0;
          auVar213._12_4_ = (fVar169 - fVar146) * 3.0;
          auVar188._0_8_ = CONCAT44((fVar193 - fVar237) * 3.0,(fVar192 - fVar216) * 3.0);
          auVar188._8_4_ = (fVar194 - fVar168) * 3.0;
          auVar188._12_4_ = (fVar204 - fVar169) * 3.0;
          auVar247._0_4_ = (fVar205 - fVar192) * 3.0;
          auVar247._4_4_ = (fVar206 - fVar193) * 3.0;
          auVar247._8_4_ = (fVar162 - fVar194) * 3.0;
          auVar247._12_4_ = (fVar163 - fVar204) * 3.0;
          auVar196._8_4_ = auVar188._8_4_;
          auVar196._0_8_ = auVar188._0_8_;
          auVar196._12_4_ = auVar188._12_4_;
          auVar129 = minps(auVar196,auVar247);
          auVar76 = maxps(auVar188,auVar247);
          auVar227._8_4_ = auVar213._8_4_;
          auVar227._0_8_ = auVar213._0_8_;
          auVar227._12_4_ = auVar213._12_4_;
          auVar131 = minps(auVar227,auVar129);
          auVar120 = maxps(auVar213,auVar76);
          auVar30._4_8_ = auVar76._8_8_;
          auVar30._0_4_ = auVar131._4_4_;
          auVar189._0_8_ = auVar30._0_8_ << 0x20;
          auVar189._8_4_ = auVar131._8_4_;
          auVar189._12_4_ = auVar131._12_4_;
          auVar190._8_8_ = auVar131._8_8_;
          auVar190._0_8_ = auVar189._8_8_;
          auVar31._4_8_ = auVar129._8_8_;
          auVar31._0_4_ = auVar120._4_4_;
          auVar197._0_8_ = auVar31._0_8_ << 0x20;
          auVar197._8_4_ = auVar120._8_4_;
          auVar197._12_4_ = auVar120._12_4_;
          auVar198._8_8_ = auVar120._8_8_;
          auVar198._0_8_ = auVar197._8_8_;
          auVar129 = minps(auVar131,auVar190);
          auVar76 = maxps(auVar120,auVar198);
          fVar232 = auVar129._0_4_ * fVar75;
          fVar234 = auVar129._4_4_ * fVar75;
          fVar258 = auVar129._8_4_ * fVar75;
          fVar269 = auVar129._12_4_ * fVar75;
          fVar194 = fVar75 * auVar76._0_4_;
          fVar205 = fVar75 * auVar76._4_4_;
          fVar215 = fVar75 * auVar76._8_4_;
          fVar75 = fVar75 * auVar76._12_4_;
          fVar312 = 1.0 / (fStack_42c - fVar306);
          auVar142._0_8_ = CONCAT44(fVar146 - fVar127,fVar144 - fVar126);
          auVar142._8_4_ = fVar144 - fVar144;
          auVar142._12_4_ = fVar146 - fVar146;
          auVar199._8_4_ = auVar142._8_4_;
          auVar199._0_8_ = auVar142._0_8_;
          auVar199._12_4_ = auVar142._12_4_;
          auVar120 = minps(auVar199,auVar267);
          auVar129 = maxps(auVar142,auVar267);
          auVar101._8_4_ = auVar156._8_4_;
          auVar101._0_8_ = auVar156._0_8_;
          auVar101._12_4_ = auVar156._12_4_;
          auVar76 = minps(auVar101,auVar122);
          auVar120 = minps(auVar120,auVar76);
          auVar76 = maxps(auVar156,auVar122);
          auVar76 = maxps(auVar129,auVar76);
          fVar250 = auVar120._0_4_ * fVar312;
          fVar253 = auVar120._4_4_ * fVar312;
          fVar221 = fVar312 * auVar76._0_4_;
          fVar312 = fVar312 * auVar76._4_4_;
          local_428 = CONCAT44(fStack_42c,fVar306);
          auVar191._4_4_ = fStack_42c;
          auVar191._0_4_ = fVar106;
          auVar191._8_4_ = fVar125;
          auVar191._12_4_ = fVar104;
          fVar126 = (fVar105 + fVar106) * 0.5;
          fVar127 = (fVar306 + fStack_42c) * 0.5;
          fVar144 = (fVar106 + fVar125) * 0.0;
          fVar146 = (fStack_42c + fVar104) * 0.0;
          fVar162 = local_88 * fVar126 + local_318;
          fVar164 = fStack_84 * fVar126 + fStack_314;
          fVar163 = fStack_80 * fVar126 + fStack_310;
          fVar167 = fStack_7c * fVar126 + fStack_30c;
          fVar168 = local_98 * fVar126 + (float)local_328._0_4_;
          fVar169 = fStack_94 * fVar126 + (float)local_328._4_4_;
          fVar192 = fStack_90 * fVar126 + fStack_320;
          fVar193 = fStack_8c * fVar126 + fStack_31c;
          fVar162 = (fVar168 - fVar162) * fVar126 + fVar162;
          fVar164 = (fVar169 - fVar164) * fVar126 + fVar164;
          fVar163 = (fVar192 - fVar163) * fVar126 + fVar163;
          fVar167 = (fVar193 - fVar167) * fVar126 + fVar167;
          fVar168 = (((local_a8 * fVar126 + (float)local_338) - fVar168) * fVar126 + fVar168) -
                    fVar162;
          fVar169 = (((fStack_a4 * fVar126 + local_338._4_4_) - fVar169) * fVar126 + fVar169) -
                    fVar164;
          fVar192 = (((fStack_a0 * fVar126 + (float)uStack_330) - fVar192) * fVar126 + fVar192) -
                    fVar163;
          fVar193 = (((fStack_9c * fVar126 + uStack_330._4_4_) - fVar193) * fVar126 + fVar193) -
                    fVar167;
          fVar162 = fVar126 * fVar168 + fVar162;
          fVar164 = fVar126 * fVar169 + fVar164;
          fVar168 = fVar168 * 3.0;
          fVar169 = fVar169 * 3.0;
          fVar163 = (fVar126 * fVar192 + fVar163) - fVar162;
          fVar167 = (fVar126 * fVar193 + fVar167) - fVar164;
          fVar168 = (fVar192 * 3.0 - fVar168) * fVar127 + fVar168;
          fVar169 = (fVar193 * 3.0 - fVar169) * fVar127 + fVar169;
          auVar123._0_8_ = CONCAT44(fVar168,fVar163) ^ 0x80000000;
          auVar123._8_4_ = fVar168;
          auVar123._12_4_ = fVar168;
          fVar272 = fVar105 - fVar126;
          fVar280 = fVar306 - fVar127;
          fVar290 = fVar106 - fVar144;
          fVar292 = fStack_42c - fVar146;
          fVar294 = fVar106 - fVar126;
          fVar296 = fStack_42c - fVar127;
          fVar125 = fVar125 - fVar144;
          fVar104 = fVar104 - fVar146;
          fVar162 = fVar163 * fVar127 + fVar162;
          fVar164 = fVar167 * fVar127 + fVar164;
          auVar143._0_8_ = CONCAT44(fVar169,fVar167) ^ 0x8000000000000000;
          auVar143._8_4_ = -fVar169;
          auVar143._12_4_ = -fVar169;
          auVar303._0_4_ = fVar167 * fVar168 - fVar169 * fVar163;
          auVar303._4_4_ = auVar303._0_4_;
          auVar303._8_4_ = auVar303._0_4_;
          auVar303._12_4_ = auVar303._0_4_;
          auVar129 = divps(auVar143,auVar303);
          auVar76 = divps(auVar123,auVar303);
          fVar168 = auVar129._0_4_;
          fVar169 = auVar129._4_4_;
          fVar163 = auVar76._0_4_;
          fVar167 = auVar76._4_4_;
          fVar126 = fVar126 - (fVar164 * fVar163 + fVar162 * fVar168);
          fVar144 = fVar127 - (fVar164 * fVar167 + fVar162 * fVar169);
          fVar146 = fVar127 - (fVar164 * auVar76._8_4_ + fVar162 * auVar129._8_4_);
          fVar127 = fVar127 - (fVar164 * auVar76._12_4_ + fVar162 * auVar129._12_4_);
          auVar325._0_8_ = CONCAT44(fVar169 * fVar250,fVar169 * fVar232);
          auVar325._8_4_ = fVar169 * fVar234;
          auVar325._12_4_ = fVar169 * fVar253;
          auVar248._0_4_ = fVar169 * fVar194;
          auVar248._4_4_ = fVar169 * fVar221;
          auVar248._8_4_ = fVar169 * fVar205;
          auVar248._12_4_ = fVar169 * fVar312;
          auVar331._8_4_ = auVar325._8_4_;
          auVar331._0_8_ = auVar325._0_8_;
          auVar331._12_4_ = auVar325._12_4_;
          auVar131 = minps(auVar331,auVar248);
          auVar129 = maxps(auVar248,auVar325);
          auVar157._0_8_ = CONCAT44(fVar167 * fVar253,fVar167 * fVar234);
          auVar157._8_4_ = fVar167 * fVar258;
          auVar157._12_4_ = fVar167 * fVar269;
          auVar326._0_4_ = fVar167 * fVar205;
          auVar326._4_4_ = fVar167 * fVar312;
          auVar326._8_4_ = fVar167 * fVar215;
          auVar326._12_4_ = fVar167 * fVar75;
          auVar228._8_4_ = auVar157._8_4_;
          auVar228._0_8_ = auVar157._0_8_;
          auVar228._12_4_ = auVar157._12_4_;
          auVar76 = minps(auVar228,auVar326);
          auVar120 = maxps(auVar326,auVar157);
          fVar162 = 0.0 - (auVar120._0_4_ + auVar129._0_4_);
          fVar164 = 1.0 - (auVar120._4_4_ + auVar129._4_4_);
          fVar192 = 0.0 - (auVar120._8_4_ + auVar129._8_4_);
          fVar193 = 0.0 - (auVar120._12_4_ + auVar129._12_4_);
          fVar204 = 0.0 - (auVar76._0_4_ + auVar131._0_4_);
          fVar206 = 1.0 - (auVar76._4_4_ + auVar131._4_4_);
          fVar216 = 0.0 - (auVar76._8_4_ + auVar131._8_4_);
          fVar237 = 0.0 - (auVar76._12_4_ + auVar131._12_4_);
          auVar249._0_8_ = CONCAT44(fVar280 * fVar164,fVar272 * fVar162);
          auVar249._8_4_ = fVar290 * fVar192;
          auVar249._12_4_ = fVar292 * fVar193;
          auVar304._0_8_ = CONCAT44(fVar250 * fVar168,fVar232 * fVar168);
          auVar304._8_4_ = fVar234 * fVar168;
          auVar304._12_4_ = fVar253 * fVar168;
          auVar229._0_4_ = fVar168 * fVar194;
          auVar229._4_4_ = fVar168 * fVar221;
          auVar229._8_4_ = fVar168 * fVar205;
          auVar229._12_4_ = fVar168 * fVar312;
          auVar315._8_4_ = auVar304._8_4_;
          auVar315._0_8_ = auVar304._0_8_;
          auVar315._12_4_ = auVar304._12_4_;
          auVar129 = minps(auVar315,auVar229);
          auVar76 = maxps(auVar229,auVar304);
          auVar200._0_8_ = CONCAT44(fVar253 * fVar163,fVar234 * fVar163);
          auVar200._8_4_ = fVar258 * fVar163;
          auVar200._12_4_ = fVar269 * fVar163;
          auVar327._0_4_ = fVar163 * fVar205;
          auVar327._4_4_ = fVar163 * fVar312;
          auVar327._8_4_ = fVar163 * fVar215;
          auVar327._12_4_ = fVar163 * fVar75;
          auVar332._8_4_ = auVar200._8_4_;
          auVar332._0_8_ = auVar200._0_8_;
          auVar332._12_4_ = auVar200._12_4_;
          auVar131 = minps(auVar332,auVar327);
          auVar305._0_4_ = fVar272 * fVar204;
          auVar305._4_4_ = fVar280 * fVar206;
          auVar305._8_4_ = fVar290 * fVar216;
          auVar305._12_4_ = fVar292 * fVar237;
          auVar158._0_8_ = CONCAT44(fVar164 * fVar296,fVar162 * fVar294);
          auVar158._8_4_ = fVar192 * fVar125;
          auVar158._12_4_ = fVar193 * fVar104;
          auVar166._0_4_ = fVar204 * fVar294;
          auVar166._4_4_ = fVar206 * fVar296;
          auVar166._8_4_ = fVar216 * fVar125;
          auVar166._12_4_ = fVar237 * fVar104;
          auVar120 = maxps(auVar327,auVar200);
          auVar322._0_4_ = auVar120._0_4_ + auVar76._0_4_;
          auVar322._4_4_ = auVar120._4_4_ + auVar76._4_4_;
          auVar322._8_4_ = auVar120._8_4_ + auVar76._8_4_;
          auVar322._12_4_ = auVar120._12_4_ + auVar76._12_4_;
          fVar75 = 1.0 - (auVar131._0_4_ + auVar129._0_4_);
          fVar162 = 0.0 - (auVar131._4_4_ + auVar129._4_4_);
          fVar164 = 0.0 - (auVar131._8_4_ + auVar129._8_4_);
          fVar192 = 0.0 - (auVar131._12_4_ + auVar129._12_4_);
          auVar230._0_8_ =
               CONCAT44(fVar280 * (0.0 - auVar322._4_4_),fVar272 * (1.0 - auVar322._0_4_));
          auVar230._8_4_ = fVar290 * (0.0 - auVar322._8_4_);
          auVar230._12_4_ = fVar292 * (0.0 - auVar322._12_4_);
          auVar268._0_4_ = fVar272 * fVar75;
          auVar268._4_4_ = fVar280 * fVar162;
          auVar268._8_4_ = fVar290 * fVar164;
          auVar268._12_4_ = fVar292 * fVar192;
          auVar201._0_8_ =
               CONCAT44((0.0 - auVar322._4_4_) * fVar296,(1.0 - auVar322._0_4_) * fVar294);
          auVar201._8_4_ = (0.0 - auVar322._8_4_) * fVar125;
          auVar201._12_4_ = (0.0 - auVar322._12_4_) * fVar104;
          auVar214._0_4_ = fVar75 * fVar294;
          auVar214._4_4_ = fVar162 * fVar296;
          auVar214._8_4_ = fVar164 * fVar125;
          auVar214._12_4_ = fVar192 * fVar104;
          auVar289._8_4_ = auVar230._8_4_;
          auVar289._0_8_ = auVar230._0_8_;
          auVar289._12_4_ = auVar230._12_4_;
          auVar76 = minps(auVar289,auVar268);
          auVar316._8_4_ = auVar201._8_4_;
          auVar316._0_8_ = auVar201._0_8_;
          auVar316._12_4_ = auVar201._12_4_;
          auVar129 = minps(auVar316,auVar214);
          auVar131 = minps(auVar76,auVar129);
          auVar129 = maxps(auVar268,auVar230);
          auVar76 = maxps(auVar214,auVar201);
          auVar120 = maxps(auVar76,auVar129);
          auVar202._8_4_ = auVar249._8_4_;
          auVar202._0_8_ = auVar249._0_8_;
          auVar202._12_4_ = auVar249._12_4_;
          auVar76 = minps(auVar202,auVar305);
          auVar231._8_4_ = auVar158._8_4_;
          auVar231._0_8_ = auVar158._0_8_;
          auVar231._12_4_ = auVar158._12_4_;
          auVar129 = minps(auVar231,auVar166);
          auVar129 = minps(auVar76,auVar129);
          auVar321 = maxps(auVar305,auVar249);
          auVar76 = maxps(auVar166,auVar158);
          auVar76 = maxps(auVar76,auVar321);
          auVar203._0_4_ = auVar131._4_4_ + auVar131._0_4_ + fVar126;
          auVar203._4_4_ = auVar129._4_4_ + auVar129._0_4_ + fVar144;
          auVar203._8_4_ = auVar131._8_4_ + auVar131._4_4_ + fVar146;
          auVar203._12_4_ = auVar131._12_4_ + auVar129._4_4_ + fVar127;
          fVar75 = auVar120._4_4_ + auVar120._0_4_ + fVar126;
          fVar104 = auVar76._4_4_ + auVar76._0_4_ + fVar144;
          auVar159._4_4_ = fVar104;
          auVar159._0_4_ = fVar75;
          auVar33._4_4_ = fVar306;
          auVar33._0_4_ = fVar105;
          auVar33._8_4_ = fVar106;
          auVar33._12_4_ = fStack_42c;
          auVar129 = maxps(auVar33,auVar203);
          auVar159._8_4_ = auVar120._8_4_ + auVar120._4_4_ + fVar146;
          auVar159._12_4_ = auVar120._12_4_ + auVar76._4_4_ + fVar127;
          auVar76 = minps(auVar159,auVar191);
          iVar63 = -(uint)(auVar76._0_4_ < auVar129._0_4_);
          iVar71 = -(uint)(auVar76._4_4_ < auVar129._4_4_);
          auVar161._4_4_ = iVar71;
          auVar161._0_4_ = iVar63;
          auVar161._8_4_ = iVar71;
          auVar161._12_4_ = iVar71;
          auVar160._8_8_ = auVar161._8_8_;
          auVar160._4_4_ = iVar63;
          auVar160._0_4_ = iVar63;
          uVar70 = movmskpd((int)uVar64,auVar160);
          uVar64 = (ulong)uVar70;
          fStack_430 = fVar106;
          if (uVar70 == 0) {
            uVar64 = 0;
            if (auVar203._0_4_ <= fVar105) {
              auVar322._0_12_ = ZEXT812(0x40400000);
              auVar322._12_4_ = 0.0;
              auVar333._4_4_ = fStack_314;
              auVar333._0_4_ = local_318;
              auVar333._8_4_ = fStack_310;
              auVar333._12_4_ = fStack_30c;
            }
            else {
              auVar322._0_12_ = ZEXT812(0x40400000);
              auVar322._12_4_ = 0.0;
              auVar333._4_4_ = fStack_314;
              auVar333._0_4_ = local_318;
              auVar333._8_4_ = fStack_310;
              auVar333._12_4_ = fStack_30c;
              if (fVar75 < fVar106) {
                iVar63 = -(uint)(fVar104 < fStack_42c);
                uVar64 = (ulong)CONCAT11((char)((uint)iVar63 >> 8),
                                         (byte)iVar63 & fVar306 < auVar203._4_4_);
              }
            }
            bVar57 = bVar68 | (byte)uVar64;
            uVar60 = (ulong)CONCAT31(uVar29,bVar57);
            if (bVar57 == 1) {
              uVar60 = 200;
              do {
                fVar104 = 1.0 - fVar126;
                fVar125 = fVar126 * fVar126 * fVar126;
                fVar146 = auVar322._0_4_;
                fVar106 = fVar126 * fVar126 * fVar146 * fVar104;
                fVar75 = fVar104 * fVar104 * fVar104;
                fVar127 = fVar126 * fVar146 * fVar104 * fVar104;
                fVar104 = fVar75 * auVar333._0_4_ +
                          fVar127 * (float)local_328._0_4_ +
                          fVar106 * (float)local_338 + fVar125 * (float)local_b8._0_4_;
                fVar105 = fVar75 * auVar333._4_4_ +
                          fVar127 * (float)local_328._4_4_ +
                          fVar106 * local_338._4_4_ + fVar125 * (float)local_b8._4_4_;
                fVar104 = ((fVar75 * auVar333._8_4_ +
                           fVar127 * fStack_320 + fVar106 * (float)uStack_330 + fVar125 * fStack_b0)
                          - fVar104) * fVar144 + fVar104;
                fVar105 = ((fVar75 * auVar333._12_4_ +
                           fVar127 * fStack_31c + fVar106 * uStack_330._4_4_ + fVar125 * fStack_ac)
                          - fVar105) * fVar144 + fVar105;
                fVar126 = fVar126 - (fVar105 * fVar163 + fVar104 * fVar168);
                fVar144 = fVar144 - (fVar105 * fVar167 + fVar104 * fVar169);
                fVar75 = ABS(fVar105);
                if (ABS(fVar105) <= ABS(fVar104)) {
                  fVar75 = ABS(fVar104);
                }
                if (fVar75 < fVar145) {
                  if ((((0.0 <= fVar126) && (fVar126 <= 1.0)) && (0.0 <= fVar144)) &&
                     (fVar144 <= 1.0)) {
                    fVar75 = (pre->ray_space).vx.field_0.m128[2];
                    fVar104 = (pre->ray_space).vy.field_0.m128[2];
                    fVar105 = (pre->ray_space).vz.field_0.m128[2];
                    fVar106 = (ray->org).field_0.m128[0];
                    fVar125 = (ray->org).field_0.m128[1];
                    fVar127 = (ray->org).field_0.m128[2];
                    fVar168 = 1.0 - fVar144;
                    fVar167 = 1.0 - fVar126;
                    fVar162 = fVar167 * fVar167 * fVar167;
                    fVar163 = fVar126 * fVar146 * fVar167 * fVar167;
                    fVar164 = fVar126 * fVar126 * fVar126;
                    fVar146 = fVar126 * fVar126 * fVar146 * fVar167;
                    fVar75 = (((fStack_390 - fVar127) * fVar105 +
                              (fStack_394 - fVar125) * fVar104 + (local_398 - fVar106) * fVar75) *
                              fVar168 +
                             ((fStack_380 - fVar127) * fVar105 +
                             (fStack_384 - fVar125) * fVar104 + (local_388 - fVar106) * fVar75) *
                             fVar144) * fVar162 +
                             (((fStack_3a0 - fVar127) * fVar105 +
                              (fStack_3a4 - fVar125) * fVar104 + (local_3a8 - fVar106) * fVar75) *
                              fVar168 +
                             ((fStack_3d0 - fVar127) * fVar105 +
                             (fStack_3d4 - fVar125) * fVar104 + (local_3d8 - fVar106) * fVar75) *
                             fVar144) * fVar163 +
                             (((fStack_3c0 - fVar127) * fVar105 +
                              (fStack_3c4 - fVar125) * fVar104 + (local_3c8 - fVar106) * fVar75) *
                              fVar168 +
                             ((fStack_3e0 - fVar127) * fVar105 +
                             (fStack_3e4 - fVar125) * fVar104 + (local_3e8 - fVar106) * fVar75) *
                             fVar144) * fVar146 +
                             (fVar168 * ((fStack_3b0 - fVar127) * fVar105 +
                                        (fStack_3b4 - fVar125) * fVar104 +
                                        (local_3b8 - fVar106) * fVar75) +
                             ((fStack_2b0 - fVar127) * fVar105 +
                             (fStack_2b4 - fVar125) * fVar104 + (local_2b8 - fVar106) * fVar75) *
                             fVar144) * fVar164;
                    if (((ray->org).field_0.m128[3] <= fVar75) &&
                       (fVar104 = ray->tfar, fVar75 <= fVar104)) {
                      fVar127 = 1.0 - fVar144;
                      fVar168 = 1.0 - fVar144;
                      fVar169 = 1.0 - fVar144;
                      fVar105 = local_3a8 * fVar127 + local_3d8 * fVar144;
                      fVar106 = fStack_3a4 * fVar168 + fStack_3d4 * fVar144;
                      fVar125 = fStack_3a0 * fVar169 + fStack_3d0 * fVar144;
                      fVar192 = local_3c8 * fVar127 + local_3e8 * fVar144;
                      fVar194 = fStack_3c4 * fVar168 + fStack_3e4 * fVar144;
                      fVar205 = fStack_3c0 * fVar169 + fStack_3e0 * fVar144;
                      fVar193 = fVar192 - fVar105;
                      fVar204 = fVar194 - fVar106;
                      fVar206 = fVar205 - fVar125;
                      fVar105 = (((fVar105 - (local_398 * fVar127 + local_388 * fVar144)) * fVar167
                                 + fVar126 * fVar193) * fVar167 +
                                (fVar193 * fVar167 +
                                ((fVar127 * local_3b8 + fVar144 * local_2b8) - fVar192) * fVar126) *
                                fVar126) * 3.0;
                      fVar106 = (((fVar106 - (fStack_394 * fVar168 + fStack_384 * fVar144)) *
                                  fVar167 + fVar126 * fVar204) * fVar167 +
                                (fVar204 * fVar167 +
                                ((fVar168 * fStack_3b4 + fVar144 * fStack_2b4) - fVar194) * fVar126)
                                * fVar126) * 3.0;
                      fVar125 = (((fVar125 - (fStack_390 * fVar169 + fStack_380 * fVar144)) *
                                  fVar167 + fVar126 * fVar206) * fVar167 +
                                (fVar206 * fVar167 +
                                ((fVar169 * fStack_3b0 + fVar144 * fStack_2b0) - fVar205) * fVar126)
                                * fVar126) * 3.0;
                      pGVar16 = (context->scene->geometries).items[local_360].ptr;
                      if ((pGVar16->mask & ray->mask) == 0) {
                        uVar60 = 0;
                      }
                      else if ((context->args->filter != (RTCFilterFunctionN)0x0) ||
                              (uVar60 = CONCAT71((int7)((ulong)context->args >> 8),1),
                              pGVar16->occlusionFilterN != (RTCFilterFunctionN)0x0)) {
                        fVar127 = fVar162 * local_188 +
                                  fVar163 * local_198 + fVar146 * local_1a8 + fVar164 * local_1b8;
                        fVar167 = fVar162 * fStack_184 +
                                  fVar163 * fStack_194 + fVar146 * fStack_1a4 + fVar164 * fStack_1b4
                        ;
                        fVar146 = fVar162 * fStack_180 +
                                  fVar163 * fStack_190 + fVar146 * fStack_1a0 + fVar164 * fStack_1b0
                        ;
                        local_1e8 = CONCAT44(fVar127 * fVar125 - fVar105 * fVar146,
                                             fVar146 * fVar106 - fVar125 * fVar167);
                        local_1e0 = fVar167 * fVar105 - fVar106 * fVar127;
                        local_1dc = fVar126;
                        fStack_1d8 = fVar144;
                        local_1d4 = (int)local_300;
                        local_1d0 = (int)local_360;
                        local_1cc = context->user->instID[0];
                        local_1c8 = context->user->instPrimID[0];
                        ray->tfar = fVar75;
                        local_3ec = 0xffffffff;
                        local_2e8.valid = &local_3ec;
                        local_2e8.geometryUserPtr = pGVar16->userPtr;
                        local_2e8.context = context->user;
                        local_2e8.hit = (RTCHitN *)&local_1e8;
                        local_2e8.N = 1;
                        local_2e8.ray = (RTCRayN *)ray;
                        if ((pGVar16->occlusionFilterN == (RTCFilterFunctionN)0x0) ||
                           ((*pGVar16->occlusionFilterN)(&local_2e8), *local_2e8.valid != 0)) {
                          p_Var62 = context->args->filter;
                          if (p_Var62 != (RTCFilterFunctionN)0x0) {
                            if (((context->args->flags & RTC_RAY_QUERY_FLAG_INVOKE_ARGUMENT_FILTER)
                                 != RTC_RAY_QUERY_FLAG_INCOHERENT) ||
                               (((pGVar16->field_8).field_0x2 & 0x40) != 0)) {
                              (*p_Var62)(&local_2e8);
                            }
                            p_Var62 = (RTCFilterFunctionN)local_2e8.valid;
                            if (*local_2e8.valid == 0) goto LAB_00bd2922;
                          }
                          uVar60 = CONCAT71((int7)((ulong)p_Var62 >> 8),1);
                        }
                        else {
LAB_00bd2922:
                          uVar60 = 0;
                        }
                        if ((char)uVar60 == '\0') {
                          ray->tfar = fVar104;
                        }
                      }
                      local_43c = (uint)(byte)((byte)local_43c | (byte)uVar60);
                      uVar64 = (ulong)local_43c;
                    }
                  }
                  break;
                }
                uVar60 = uVar60 - 1;
              } while (uVar60 != 0);
            }
            else {
              bVar22 = false;
            }
          }
        }
      }
    } while (bVar22);
  } while( true );
}

Assistant:

static __forceinline bool occluded_n(const Precalculations& pre, Ray& ray, RayQueryContext* context, const Primitive& prim)
      {
        vfloat<M> tNear;
        vbool<M> valid = intersect(ray,prim,tNear);

        const size_t N = prim.N;
        size_t mask = movemask(valid);
        while (mask)
        {
          const size_t i = bscf(mask);
          STAT3(shadow.trav_prims,1,1,1);
          const unsigned int geomID = prim.geomID(N);
          const unsigned int primID = prim.primID(N)[i];
          const CurveGeometry* geom = context->scene->get<CurveGeometry>(geomID);
          const TensorLinearCubicBezierSurface3fa curve = geom->getNormalOrientedCurve<typename Intersector::SourceCurve3ff, typename Intersector::SourceCurve3fa, TensorLinearCubicBezierSurface3fa>(context, ray.org, primID,ray.time());

          if (Intersector().intersect(pre,ray,context,geom,primID,curve,Epilog(ray,context,geomID,primID)))
              return true;

          mask &= movemask(tNear <= vfloat<M>(ray.tfar));
        }
        return false;
      }